

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx2::CurveNiMBIntersectorK<4,4>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  int iVar28;
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  uint uVar56;
  uint uVar57;
  ulong uVar58;
  ulong uVar59;
  long lVar60;
  byte bVar61;
  uint uVar62;
  uint uVar63;
  long lVar64;
  uint uVar65;
  float fVar66;
  float fVar67;
  undefined4 uVar68;
  float fVar100;
  float fVar101;
  vint4 bi_2;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar102;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined8 uVar103;
  undefined8 extraout_XMM1_Qa;
  vint4 bi_1;
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 extraout_var [56];
  vint4 bi;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar142;
  float fVar164;
  float fVar165;
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar166;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar143;
  undefined1 auVar151 [16];
  float fVar144;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  vint4 ai_2;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [32];
  vint4 ai_1;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [64];
  vint4 ai;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  float fVar219;
  float fVar236;
  float fVar238;
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar237;
  float fVar239;
  undefined1 auVar235 [32];
  float fVar243;
  float fVar257;
  float fVar258;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar259;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar251 [16];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar260;
  float fVar273;
  __m128 a;
  undefined1 auVar299 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [32];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [64];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [32];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar323 [16];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  float fVar329;
  float fVar337;
  float fVar338;
  undefined1 auVar330 [16];
  float fVar339;
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar336 [32];
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p03;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_608 [8];
  undefined8 uStack_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined1 local_5b8 [8];
  float fStack_5b0;
  float fStack_5ac;
  float local_598;
  float fStack_594;
  float fStack_590;
  undefined1 local_578 [8];
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 uStack_560;
  undefined1 local_558 [8];
  float fStack_550;
  float fStack_54c;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  undefined1 local_508 [32];
  float local_4e8;
  float fStack_4e4;
  float fStack_4e0;
  float fStack_4dc;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4c8;
  float fStack_4c4;
  float fStack_4c0;
  float fStack_4bc;
  undefined1 local_478 [8];
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  float fStack_460;
  float fStack_45c;
  undefined1 local_458 [16];
  undefined1 (*local_448) [16];
  Primitive *local_440;
  undefined1 local_438 [8];
  float fStack_430;
  float fStack_42c;
  undefined1 auStack_428 [16];
  RTCFilterFunctionNArguments local_418;
  undefined1 local_3e8 [8];
  float fStack_3e0;
  float fStack_3dc;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  uint auStack_388 [4];
  uint local_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint local_368;
  uint uStack_364;
  uint uStack_360;
  uint uStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  uint uStack_248;
  float afStack_244 [7];
  RTCHitN local_228 [16];
  undefined1 local_218 [16];
  undefined4 local_208;
  undefined4 uStack_204;
  undefined4 uStack_200;
  undefined4 uStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  uint local_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  uint uStack_1a0;
  uint uStack_19c;
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  float fStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ulong auStack_58 [5];
  float fVar218;
  undefined1 auVar335 [32];
  
  PVar6 = prim[1];
  uVar58 = (ulong)(byte)PVar6;
  lVar60 = uVar58 * 0x25;
  auVar160 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar160 = vinsertps_avx(auVar160,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar161 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar161 = vinsertps_avx(auVar161,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar66 = *(float *)(prim + lVar60 + 0x12);
  auVar160 = vsubps_avx(auVar160,*(undefined1 (*) [16])(prim + lVar60 + 6));
  auVar69._0_4_ = fVar66 * auVar160._0_4_;
  auVar69._4_4_ = fVar66 * auVar160._4_4_;
  auVar69._8_4_ = fVar66 * auVar160._8_4_;
  auVar69._12_4_ = fVar66 * auVar160._12_4_;
  auVar129._0_4_ = fVar66 * auVar161._0_4_;
  auVar129._4_4_ = fVar66 * auVar161._4_4_;
  auVar129._8_4_ = fVar66 * auVar161._8_4_;
  auVar129._12_4_ = fVar66 * auVar161._12_4_;
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 4 + 6)));
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar161 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 5 + 6)));
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar157 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 6 + 6)));
  auVar157 = vcvtdq2ps_avx(auVar157);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0xf + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar186 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + uVar58 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1a + 6)));
  auVar186 = vcvtdq2ps_avx(auVar186);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1b + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar112 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar58 * 0x1c + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar112 = vcvtdq2ps_avx(auVar112);
  auVar319._4_4_ = auVar129._0_4_;
  auVar319._0_4_ = auVar129._0_4_;
  auVar319._8_4_ = auVar129._0_4_;
  auVar319._12_4_ = auVar129._0_4_;
  auVar20 = vshufps_avx(auVar129,auVar129,0x55);
  auVar132 = vshufps_avx(auVar129,auVar129,0xaa);
  fVar66 = auVar132._0_4_;
  auVar274._0_4_ = fVar66 * auVar157._0_4_;
  fVar100 = auVar132._4_4_;
  auVar274._4_4_ = fVar100 * auVar157._4_4_;
  fVar101 = auVar132._8_4_;
  auVar274._8_4_ = fVar101 * auVar157._8_4_;
  fVar144 = auVar132._12_4_;
  auVar274._12_4_ = fVar144 * auVar157._12_4_;
  auVar261._0_4_ = auVar186._0_4_ * fVar66;
  auVar261._4_4_ = auVar186._4_4_ * fVar100;
  auVar261._8_4_ = auVar186._8_4_ * fVar101;
  auVar261._12_4_ = auVar186._12_4_ * fVar144;
  auVar244._0_4_ = auVar112._0_4_ * fVar66;
  auVar244._4_4_ = auVar112._4_4_ * fVar100;
  auVar244._8_4_ = auVar112._8_4_ * fVar101;
  auVar244._12_4_ = auVar112._12_4_ * fVar144;
  auVar132 = vfmadd231ps_fma(auVar274,auVar20,auVar161);
  auVar147 = vfmadd231ps_fma(auVar261,auVar20,auVar17);
  auVar20 = vfmadd231ps_fma(auVar244,auVar19,auVar20);
  auVar70 = vfmadd231ps_fma(auVar132,auVar319,auVar160);
  auVar147 = vfmadd231ps_fma(auVar147,auVar319,auVar16);
  auVar71 = vfmadd231ps_fma(auVar20,auVar18,auVar319);
  auVar320._4_4_ = auVar69._0_4_;
  auVar320._0_4_ = auVar69._0_4_;
  auVar320._8_4_ = auVar69._0_4_;
  auVar320._12_4_ = auVar69._0_4_;
  auVar20 = vshufps_avx(auVar69,auVar69,0x55);
  auVar132 = vshufps_avx(auVar69,auVar69,0xaa);
  fVar66 = auVar132._0_4_;
  auVar130._0_4_ = fVar66 * auVar157._0_4_;
  fVar100 = auVar132._4_4_;
  auVar130._4_4_ = fVar100 * auVar157._4_4_;
  fVar101 = auVar132._8_4_;
  auVar130._8_4_ = fVar101 * auVar157._8_4_;
  fVar144 = auVar132._12_4_;
  auVar130._12_4_ = fVar144 * auVar157._12_4_;
  auVar104._0_4_ = auVar186._0_4_ * fVar66;
  auVar104._4_4_ = auVar186._4_4_ * fVar100;
  auVar104._8_4_ = auVar186._8_4_ * fVar101;
  auVar104._12_4_ = auVar186._12_4_ * fVar144;
  auVar299._0_4_ = auVar112._0_4_ * fVar66;
  auVar299._4_4_ = auVar112._4_4_ * fVar100;
  auVar299._8_4_ = auVar112._8_4_ * fVar101;
  auVar299._12_4_ = auVar112._12_4_ * fVar144;
  auVar161 = vfmadd231ps_fma(auVar130,auVar20,auVar161);
  auVar157 = vfmadd231ps_fma(auVar104,auVar20,auVar17);
  auVar17 = vfmadd231ps_fma(auVar299,auVar20,auVar19);
  auVar104 = vfmadd231ps_fma(auVar161,auVar320,auVar160);
  auVar105 = vfmadd231ps_fma(auVar157,auVar320,auVar16);
  local_398._8_4_ = 0x7fffffff;
  local_398._0_8_ = 0x7fffffff7fffffff;
  local_398._12_4_ = 0x7fffffff;
  auVar160 = vandps_avx(auVar70,local_398);
  auVar220._8_4_ = 0x219392ef;
  auVar220._0_8_ = 0x219392ef219392ef;
  auVar220._12_4_ = 0x219392ef;
  auVar160 = vcmpps_avx(auVar160,auVar220,1);
  auVar161 = vblendvps_avx(auVar70,auVar220,auVar160);
  auVar160 = vandps_avx(auVar147,local_398);
  auVar160 = vcmpps_avx(auVar160,auVar220,1);
  auVar157 = vblendvps_avx(auVar147,auVar220,auVar160);
  auVar160 = vandps_avx(auVar71,local_398);
  auVar160 = vcmpps_avx(auVar160,auVar220,1);
  auVar160 = vblendvps_avx(auVar71,auVar220,auVar160);
  auVar106 = vfmadd231ps_fma(auVar17,auVar320,auVar18);
  auVar16 = vrcpps_avx(auVar161);
  auVar221._8_4_ = 0x3f800000;
  auVar221._0_8_ = 0x3f8000003f800000;
  auVar221._12_4_ = 0x3f800000;
  auVar161 = vfnmadd213ps_fma(auVar161,auVar16,auVar221);
  auVar70 = vfmadd132ps_fma(auVar161,auVar16,auVar16);
  auVar161 = vrcpps_avx(auVar157);
  auVar157 = vfnmadd213ps_fma(auVar157,auVar161,auVar221);
  auVar71 = vfmadd132ps_fma(auVar157,auVar161,auVar161);
  auVar161 = vrcpps_avx(auVar160);
  auVar160 = vfnmadd213ps_fma(auVar160,auVar161,auVar221);
  auVar69 = vfmadd132ps_fma(auVar160,auVar161,auVar161);
  fVar66 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar60 + 0x16)) *
           *(float *)(prim + lVar60 + 0x1a);
  auVar160._8_8_ = 0;
  auVar160._0_8_ = *(ulong *)(prim + uVar58 * 7 + 6);
  auVar160 = vpmovsxwd_avx(auVar160);
  auVar200._4_4_ = fVar66;
  auVar200._0_4_ = fVar66;
  auVar200._8_4_ = fVar66;
  auVar200._12_4_ = fVar66;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = *(ulong *)(prim + uVar58 * 0xb + 6);
  auVar161 = vpmovsxwd_avx(auVar161);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar160);
  auVar299 = vfmadd213ps_fma(auVar161,auVar200,auVar160);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = *(ulong *)(prim + uVar58 * 9 + 6);
  auVar160 = vpmovsxwd_avx(auVar157);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar58 * 0xd + 6);
  auVar161 = vpmovsxwd_avx(auVar16);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar160);
  auVar157 = vfmadd213ps_fma(auVar161,auVar200,auVar160);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar58 * 0x12 + 6);
  auVar160 = vpmovsxwd_avx(auVar17);
  uVar59 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar58 * 2 + uVar59 + 6);
  auVar161 = vpmovsxwd_avx(auVar186);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar160);
  auVar16 = vfmadd213ps_fma(auVar161,auVar200,auVar160);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar59 + 6);
  auVar160 = vpmovsxwd_avx(auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar58 * 0x18 + 6);
  auVar161 = vpmovsxwd_avx(auVar19);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar160);
  auVar17 = vfmadd213ps_fma(auVar161,auVar200,auVar160);
  auVar112._8_8_ = 0;
  auVar112._0_8_ = *(ulong *)(prim + uVar58 * 0x1d + 6);
  auVar160 = vpmovsxwd_avx(auVar112);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar58 + (ulong)(byte)PVar6 * 0x20 + 6);
  auVar161 = vpmovsxwd_avx(auVar20);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar160);
  auVar186 = vfmadd213ps_fma(auVar161,auVar200,auVar160);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar6 * 0x20 - uVar58) + 6);
  auVar160 = vpmovsxwd_avx(auVar132);
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar58 * 0x23 + 6);
  auVar161 = vpmovsxwd_avx(auVar147);
  auVar161 = vcvtdq2ps_avx(auVar161);
  auVar161 = vsubps_avx(auVar161,auVar160);
  auVar161 = vfmadd213ps_fma(auVar161,auVar200,auVar160);
  auVar160 = vsubps_avx(auVar299,auVar104);
  auVar188._0_4_ = auVar70._0_4_ * auVar160._0_4_;
  auVar188._4_4_ = auVar70._4_4_ * auVar160._4_4_;
  auVar188._8_4_ = auVar70._8_4_ * auVar160._8_4_;
  auVar188._12_4_ = auVar70._12_4_ * auVar160._12_4_;
  auVar160 = vsubps_avx(auVar157,auVar104);
  auVar291._0_4_ = auVar70._0_4_ * auVar160._0_4_;
  auVar291._4_4_ = auVar70._4_4_ * auVar160._4_4_;
  auVar291._8_4_ = auVar70._8_4_ * auVar160._8_4_;
  auVar291._12_4_ = auVar70._12_4_ * auVar160._12_4_;
  auVar160 = vsubps_avx(auVar16,auVar105);
  auVar154._0_4_ = auVar71._0_4_ * auVar160._0_4_;
  auVar154._4_4_ = auVar71._4_4_ * auVar160._4_4_;
  auVar154._8_4_ = auVar71._8_4_ * auVar160._8_4_;
  auVar154._12_4_ = auVar71._12_4_ * auVar160._12_4_;
  auVar160 = vsubps_avx(auVar17,auVar105);
  auVar105._0_4_ = auVar71._0_4_ * auVar160._0_4_;
  auVar105._4_4_ = auVar71._4_4_ * auVar160._4_4_;
  auVar105._8_4_ = auVar71._8_4_ * auVar160._8_4_;
  auVar105._12_4_ = auVar71._12_4_ * auVar160._12_4_;
  auVar160 = vsubps_avx(auVar186,auVar106);
  auVar167._0_4_ = auVar69._0_4_ * auVar160._0_4_;
  auVar167._4_4_ = auVar69._4_4_ * auVar160._4_4_;
  auVar167._8_4_ = auVar69._8_4_ * auVar160._8_4_;
  auVar167._12_4_ = auVar69._12_4_ * auVar160._12_4_;
  auVar160 = vsubps_avx(auVar161,auVar106);
  auVar70._0_4_ = auVar69._0_4_ * auVar160._0_4_;
  auVar70._4_4_ = auVar69._4_4_ * auVar160._4_4_;
  auVar70._8_4_ = auVar69._8_4_ * auVar160._8_4_;
  auVar70._12_4_ = auVar69._12_4_ * auVar160._12_4_;
  auVar160 = vpminsd_avx(auVar188,auVar291);
  auVar161 = vpminsd_avx(auVar154,auVar105);
  auVar160 = vmaxps_avx(auVar160,auVar161);
  auVar161 = vpminsd_avx(auVar167,auVar70);
  uVar68 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar245._4_4_ = uVar68;
  auVar245._0_4_ = uVar68;
  auVar245._8_4_ = uVar68;
  auVar245._12_4_ = uVar68;
  auVar161 = vmaxps_avx(auVar161,auVar245);
  auVar160 = vmaxps_avx(auVar160,auVar161);
  local_358._0_4_ = auVar160._0_4_ * 0.99999964;
  local_358._4_4_ = auVar160._4_4_ * 0.99999964;
  local_358._8_4_ = auVar160._8_4_ * 0.99999964;
  local_358._12_4_ = auVar160._12_4_ * 0.99999964;
  auVar160 = vpmaxsd_avx(auVar188,auVar291);
  auVar161 = vpmaxsd_avx(auVar154,auVar105);
  auVar160 = vminps_avx(auVar160,auVar161);
  auVar161 = vpmaxsd_avx(auVar167,auVar70);
  uVar68 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar131._4_4_ = uVar68;
  auVar131._0_4_ = uVar68;
  auVar131._8_4_ = uVar68;
  auVar131._12_4_ = uVar68;
  auVar161 = vminps_avx(auVar161,auVar131);
  auVar160 = vminps_avx(auVar160,auVar161);
  auVar71._0_4_ = auVar160._0_4_ * 1.0000004;
  auVar71._4_4_ = auVar160._4_4_ * 1.0000004;
  auVar71._8_4_ = auVar160._8_4_ * 1.0000004;
  auVar71._12_4_ = auVar160._12_4_ * 1.0000004;
  auVar106._1_3_ = 0;
  auVar106[0] = PVar6;
  auVar106[4] = PVar6;
  auVar106._5_3_ = 0;
  auVar106[8] = PVar6;
  auVar106._9_3_ = 0;
  auVar106[0xc] = PVar6;
  auVar106._13_3_ = 0;
  auVar161 = vpcmpgtd_avx(auVar106,_DAT_01f7fcf0);
  auVar160 = vcmpps_avx(local_358,auVar71,2);
  auVar160 = vandps_avx(auVar160,auVar161);
  uVar56 = vmovmskps_avx(auVar160);
  if (uVar56 == 0) {
    return;
  }
  uVar56 = uVar56 & 0xff;
  auVar97._16_16_ = mm_lookupmask_ps._240_16_;
  auVar97._0_16_ = mm_lookupmask_ps._240_16_;
  local_198 = vblendps_avx(auVar97,ZEXT832(0) << 0x20,0x80);
  local_448 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_440 = prim;
  do {
    lVar60 = 0;
    for (uVar58 = (ulong)uVar56; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
      lVar60 = lVar60 + 1;
    }
    uVar57 = *(uint *)(local_440 + 2);
    uVar7 = *(uint *)(local_440 + lVar60 * 4 + 6);
    pGVar8 = (context->scene->geometries).items[uVar57].ptr;
    fVar66 = (pGVar8->time_range).lower;
    fVar101 = pGVar8->fnumTimeSegments *
              ((*(float *)(ray + k * 4 + 0x70) - fVar66) / ((pGVar8->time_range).upper - fVar66));
    auVar160 = vroundss_avx(ZEXT416((uint)fVar101),ZEXT416((uint)fVar101),9);
    auVar160 = vminss_avx(auVar160,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
    auVar20 = vmaxss_avx(ZEXT816(0),auVar160);
    uVar58 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                             (ulong)uVar7 *
                             pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                             _M_i);
    _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar64 = (long)(int)auVar20._0_4_ * 0x38;
    lVar10 = *(long *)(_Var9 + lVar64);
    lVar11 = *(long *)(_Var9 + 0x10 + lVar64);
    auVar160 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar58);
    lVar60 = uVar58 + 1;
    auVar161 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar60);
    lVar1 = uVar58 + 2;
    auVar157 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
    lVar2 = uVar58 + 3;
    pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
    auVar54 = *pauVar3;
    fVar66 = *(float *)pauVar3[1];
    lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
    lVar11 = *(long *)(lVar10 + lVar64);
    lVar12 = *(long *)(lVar10 + 0x10 + lVar64);
    auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar58);
    auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar60);
    auVar186 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
    pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
    fVar100 = *pfVar4;
    fVar144 = pfVar4[1];
    fVar67 = pfVar4[2];
    fVar143 = pfVar4[3];
    auVar307._0_4_ = *(float *)*pauVar3 * 0.0;
    auVar307._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
    auVar307._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
    auVar307._12_4_ = fVar66 * 0.0;
    auVar296._8_4_ = 0x3f000000;
    auVar296._0_8_ = 0x3f0000003f000000;
    auVar296._12_4_ = 0x3f000000;
    auVar18 = vfmadd231ps_fma(auVar307,auVar157,auVar296);
    auVar18 = vfmadd231ps_fma(auVar18,auVar161,ZEXT816(0) << 0x40);
    auVar291 = vfnmadd231ps_fma(auVar18,auVar160,auVar296);
    auVar201._8_4_ = 0x80000000;
    auVar201._0_8_ = 0x8000000080000000;
    auVar201._12_4_ = 0x80000000;
    auVar246._0_4_ = fVar100 * -0.0;
    auVar246._4_4_ = fVar144 * -0.0;
    auVar246._8_4_ = fVar67 * -0.0;
    auVar246._12_4_ = fVar143 * -0.0;
    auVar18 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar186,auVar246);
    auVar222._0_4_ = auVar17._0_4_ + auVar18._0_4_;
    auVar222._4_4_ = auVar17._4_4_ + auVar18._4_4_;
    auVar222._8_4_ = auVar17._8_4_ + auVar18._8_4_;
    auVar222._12_4_ = auVar17._12_4_ + auVar18._12_4_;
    auVar18 = vfmadd231ps_fma(auVar222,auVar16,auVar201);
    auVar132 = ZEXT816(0) << 0x20;
    auVar202._0_4_ = fVar100 * 0.0;
    auVar202._4_4_ = fVar144 * 0.0;
    auVar202._8_4_ = fVar67 * 0.0;
    auVar202._12_4_ = fVar143 * 0.0;
    auVar19 = vfmadd231ps_fma(auVar202,auVar186,auVar296);
    auVar19 = vfmadd231ps_fma(auVar19,auVar17,auVar132);
    auVar112 = vfnmadd231ps_fma(auVar19,auVar16,auVar296);
    auVar289._0_4_ = *(float *)*pauVar3 * 0.5;
    auVar289._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
    auVar289._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
    auVar289._12_4_ = fVar66 * 0.5;
    auVar19 = vfmadd231ps_fma(auVar289,auVar132,auVar157);
    auVar19 = vfnmadd231ps_fma(auVar19,auVar296,auVar161);
    auVar70 = vfmadd231ps_fma(auVar19,auVar132,auVar160);
    auVar247._0_4_ = auVar246._0_4_ + auVar186._0_4_;
    auVar247._4_4_ = auVar246._4_4_ + auVar186._4_4_;
    auVar247._8_4_ = auVar246._8_4_ + auVar186._8_4_;
    auVar247._12_4_ = auVar246._12_4_ + auVar186._12_4_;
    auVar19 = vfmadd231ps_fma(auVar247,auVar17,auVar132);
    auVar145._8_4_ = 0x80000000;
    auVar145._0_8_ = 0x8000000080000000;
    auVar145._12_4_ = 0x80000000;
    auVar19 = vfmadd231ps_fma(auVar19,auVar16,auVar145);
    auVar181._0_4_ = fVar100 * 0.5;
    auVar181._4_4_ = fVar144 * 0.5;
    auVar181._8_4_ = fVar67 * 0.5;
    auVar181._12_4_ = fVar143 * 0.5;
    auVar186 = vfmadd231ps_fma(auVar181,auVar132,auVar186);
    auVar17 = vfnmadd231ps_fma(auVar186,auVar296,auVar17);
    auVar186 = vfmadd231ps_fma(auVar17,auVar132,auVar16);
    auVar16 = vshufps_avx(auVar291,auVar291,0xc9);
    auVar17 = vshufps_avx(auVar18,auVar18,0xc9);
    fVar242 = auVar291._0_4_;
    auVar107._0_4_ = fVar242 * auVar17._0_4_;
    fVar260 = auVar291._4_4_;
    auVar107._4_4_ = fVar260 * auVar17._4_4_;
    fVar273 = auVar291._8_4_;
    auVar107._8_4_ = fVar273 * auVar17._8_4_;
    fVar102 = auVar291._12_4_;
    auVar107._12_4_ = fVar102 * auVar17._12_4_;
    auVar71 = vfmsub231ps_fma(auVar107,auVar16,auVar18);
    auVar17 = vshufps_avx(auVar112,auVar112,0xc9);
    auVar108._0_4_ = fVar242 * auVar17._0_4_;
    auVar108._4_4_ = fVar260 * auVar17._4_4_;
    auVar108._8_4_ = fVar273 * auVar17._8_4_;
    auVar108._12_4_ = fVar102 * auVar17._12_4_;
    auVar69 = vfmsub231ps_fma(auVar108,auVar16,auVar112);
    auVar16 = vshufps_avx(auVar70,auVar70,0xc9);
    auVar17 = vshufps_avx(auVar19,auVar19,0xc9);
    fVar238 = auVar70._0_4_;
    auVar109._0_4_ = fVar238 * auVar17._0_4_;
    fVar239 = auVar70._4_4_;
    auVar109._4_4_ = fVar239 * auVar17._4_4_;
    fVar240 = auVar70._8_4_;
    auVar109._8_4_ = fVar240 * auVar17._8_4_;
    fVar241 = auVar70._12_4_;
    auVar109._12_4_ = fVar241 * auVar17._12_4_;
    auVar299 = vfmsub231ps_fma(auVar109,auVar16,auVar19);
    auVar17 = vshufps_avx(auVar186,auVar186,0xc9);
    auVar110._0_4_ = fVar238 * auVar17._0_4_;
    auVar110._4_4_ = fVar239 * auVar17._4_4_;
    auVar110._8_4_ = fVar240 * auVar17._8_4_;
    auVar110._12_4_ = fVar241 * auVar17._12_4_;
    auVar104 = vfmsub231ps_fma(auVar110,auVar16,auVar186);
    lVar11 = *(long *)(_Var9 + 0x38 + lVar64);
    lVar12 = *(long *)(_Var9 + 0x48 + lVar64);
    auVar16 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar60);
    auVar17 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
    pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
    auVar55 = *pauVar3;
    fVar143 = *(float *)pauVar3[1];
    lVar13 = *(long *)(lVar10 + 0x38 + lVar64);
    lVar10 = *(long *)(lVar10 + 0x48 + lVar64);
    auVar275._0_4_ = *(float *)*pauVar3 * 0.0;
    auVar275._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
    auVar275._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
    auVar275._12_4_ = fVar143 * 0.0;
    auVar186 = vfmadd231ps_fma(auVar275,auVar17,auVar296);
    auVar18 = vfmadd231ps_fma(auVar186,auVar16,auVar132);
    auVar186 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar58);
    auVar131 = vfnmadd231ps_fma(auVar18,auVar186,auVar296);
    auVar18 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
    pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
    fVar100 = *pfVar4;
    fVar144 = pfVar4[1];
    fVar67 = pfVar4[2];
    fVar142 = pfVar4[3];
    auVar223._8_4_ = 0x80000000;
    auVar223._0_8_ = 0x8000000080000000;
    auVar223._12_4_ = 0x80000000;
    auVar146._0_4_ = fVar100 * -0.0;
    auVar146._4_4_ = fVar144 * -0.0;
    auVar146._8_4_ = fVar67 * -0.0;
    auVar146._12_4_ = fVar142 * -0.0;
    auVar112 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar18,auVar146);
    auVar19 = *(undefined1 (*) [16])(lVar13 + lVar60 * lVar10);
    auVar182._0_4_ = auVar19._0_4_ + auVar112._0_4_;
    auVar182._4_4_ = auVar19._4_4_ + auVar112._4_4_;
    auVar182._8_4_ = auVar19._8_4_ + auVar112._8_4_;
    auVar182._12_4_ = auVar19._12_4_ + auVar112._12_4_;
    auVar112 = *(undefined1 (*) [16])(lVar13 + uVar58 * lVar10);
    auVar147 = vfmadd231ps_fma(auVar182,auVar112,auVar223);
    auVar132 = vshufps_avx(auVar147,auVar147,0xc9);
    fVar218 = auVar131._0_4_;
    auVar72._0_4_ = fVar218 * auVar132._0_4_;
    fVar219 = auVar131._4_4_;
    auVar72._4_4_ = fVar219 * auVar132._4_4_;
    fVar236 = auVar131._8_4_;
    auVar72._8_4_ = fVar236 * auVar132._8_4_;
    fVar237 = auVar131._12_4_;
    auVar72._12_4_ = fVar237 * auVar132._12_4_;
    auVar132 = vshufps_avx(auVar131,auVar131,0xc9);
    auVar105 = vfmsub231ps_fma(auVar72,auVar132,auVar147);
    auVar73._0_4_ = fVar100 * 0.0;
    auVar73._4_4_ = fVar144 * 0.0;
    auVar73._8_4_ = fVar67 * 0.0;
    auVar73._12_4_ = fVar142 * 0.0;
    auVar168._8_4_ = 0x3f000000;
    auVar168._0_8_ = 0x3f0000003f000000;
    auVar168._12_4_ = 0x3f000000;
    auVar147 = vfmadd231ps_fma(auVar73,auVar18,auVar168);
    auVar147 = vfmadd231ps_fma(auVar147,auVar19,ZEXT816(0) << 0x20);
    auVar106 = vfnmadd231ps_fma(auVar147,auVar112,auVar168);
    auVar147 = vshufps_avx(auVar106,auVar106,0xc9);
    auVar183._0_4_ = fVar218 * auVar147._0_4_;
    auVar183._4_4_ = fVar219 * auVar147._4_4_;
    auVar183._8_4_ = fVar236 * auVar147._8_4_;
    auVar183._12_4_ = fVar237 * auVar147._12_4_;
    auVar106 = vfmsub231ps_fma(auVar183,auVar132,auVar106);
    auVar74._0_4_ = auVar18._0_4_ + auVar146._0_4_;
    auVar74._4_4_ = auVar18._4_4_ + auVar146._4_4_;
    auVar74._8_4_ = auVar18._8_4_ + auVar146._8_4_;
    auVar74._12_4_ = auVar18._12_4_ + auVar146._12_4_;
    auVar111._0_4_ = fVar100 * 0.5;
    auVar111._4_4_ = fVar144 * 0.5;
    auVar111._8_4_ = fVar67 * 0.5;
    auVar111._12_4_ = fVar142 * 0.5;
    auVar147 = ZEXT416(0) << 0x20;
    auVar18 = vfmadd231ps_fma(auVar111,auVar147,auVar18);
    auVar132 = vfmadd231ps_fma(auVar74,auVar19,auVar147);
    auVar18 = vfnmadd231ps_fma(auVar18,auVar168,auVar19);
    auVar19 = vfmadd231ps_fma(auVar132,auVar112,auVar223);
    auVar112 = vfmadd231ps_fma(auVar18,auVar147,auVar112);
    auVar330._0_4_ = *(float *)*pauVar3 * 0.5;
    auVar330._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
    auVar330._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
    auVar330._12_4_ = fVar143 * 0.5;
    auVar18 = vfmadd231ps_fma(auVar330,auVar147,auVar17);
    auVar18 = vfnmadd231ps_fma(auVar18,auVar168,auVar16);
    auVar132 = vfmadd231ps_fma(auVar18,auVar147,auVar186);
    auVar50._12_4_ = 0;
    auVar50._0_12_ = ZEXT812(0);
    auVar18 = vshufps_avx(auVar19,auVar19,0xc9);
    fVar329 = auVar132._0_4_;
    auVar148._0_4_ = fVar329 * auVar18._0_4_;
    fVar337 = auVar132._4_4_;
    auVar148._4_4_ = fVar337 * auVar18._4_4_;
    fVar338 = auVar132._8_4_;
    auVar148._8_4_ = fVar338 * auVar18._8_4_;
    fVar339 = auVar132._12_4_;
    auVar148._12_4_ = fVar339 * auVar18._12_4_;
    auVar18 = vshufps_avx(auVar132,auVar132,0xc9);
    auVar129 = vfmsub231ps_fma(auVar148,auVar18,auVar19);
    auVar19 = vshufps_avx(auVar112,auVar112,0xc9);
    auVar75._0_4_ = fVar329 * auVar19._0_4_;
    auVar75._4_4_ = fVar337 * auVar19._4_4_;
    auVar75._8_4_ = fVar338 * auVar19._8_4_;
    auVar75._12_4_ = fVar339 * auVar19._12_4_;
    auVar130 = vfmsub231ps_fma(auVar75,auVar18,auVar112);
    fVar101 = fVar101 - auVar20._0_4_;
    local_558._0_4_ = auVar54._0_4_;
    local_558._4_4_ = auVar54._4_4_;
    fStack_550 = auVar54._8_4_;
    auVar76._0_4_ = (float)local_558._0_4_ * -0.0;
    auVar76._4_4_ = (float)local_558._4_4_ * -0.0;
    auVar76._8_4_ = fStack_550 * -0.0;
    auVar76._12_4_ = fVar66 * -0.0;
    auVar18 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar157,auVar76);
    auVar169._0_4_ = auVar157._0_4_ + auVar76._0_4_;
    auVar169._4_4_ = auVar157._4_4_ + auVar76._4_4_;
    auVar169._8_4_ = auVar157._8_4_ + auVar76._8_4_;
    auVar169._12_4_ = auVar157._12_4_ + auVar76._12_4_;
    auVar184._0_4_ = auVar161._0_4_ + auVar18._0_4_;
    auVar184._4_4_ = auVar161._4_4_ + auVar18._4_4_;
    auVar184._8_4_ = auVar161._8_4_ + auVar18._8_4_;
    auVar184._12_4_ = auVar161._12_4_ + auVar18._12_4_;
    auVar19 = vpermilps_avx(auVar71,0xc9);
    auVar157 = vdpps_avx(auVar19,auVar19,0x7f);
    auVar161 = vfmadd231ps_fma(auVar169,auVar161,auVar50 << 0x20);
    auVar20 = vfmadd231ps_fma(auVar184,auVar160,auVar223);
    auVar147 = vfmadd231ps_fma(auVar161,auVar160,auVar223);
    fVar100 = auVar157._0_4_;
    auVar112 = ZEXT416((uint)fVar100);
    auVar160 = vrsqrtss_avx(auVar112,auVar112);
    fVar66 = auVar160._0_4_;
    fVar66 = fVar66 * 1.5 + fVar66 * fVar66 * fVar100 * -0.5 * fVar66;
    auVar161 = vpermilps_avx(auVar69,0xc9);
    auVar160 = vdpps_avx(auVar19,auVar161,0x7f);
    auVar224._0_4_ = fVar100 * auVar161._0_4_;
    auVar224._4_4_ = fVar100 * auVar161._4_4_;
    auVar224._8_4_ = fVar100 * auVar161._8_4_;
    auVar224._12_4_ = fVar100 * auVar161._12_4_;
    fVar100 = auVar160._0_4_;
    auVar262._0_4_ = fVar100 * auVar19._0_4_;
    auVar262._4_4_ = fVar100 * auVar19._4_4_;
    auVar262._8_4_ = fVar100 * auVar19._8_4_;
    auVar262._12_4_ = fVar100 * auVar19._12_4_;
    auVar18 = vsubps_avx(auVar224,auVar262);
    auVar160 = vrcpss_avx(auVar112,auVar112);
    auVar161 = vfnmadd213ss_fma(auVar157,auVar160,SUB6416(ZEXT464(0x40000000),0));
    fVar144 = auVar160._0_4_ * auVar161._0_4_;
    auVar112 = vpermilps_avx(auVar299,0xc9);
    auVar161 = vdpps_avx(auVar112,auVar112,0x7f);
    fVar243 = auVar19._0_4_ * fVar66;
    fVar257 = auVar19._4_4_ * fVar66;
    fVar258 = auVar19._8_4_ * fVar66;
    fVar259 = auVar19._12_4_ * fVar66;
    auVar19 = vpermilps_avx(auVar104,0xc9);
    auVar160 = vblendps_avx(auVar161,_DAT_01f7aa10,0xe);
    auVar157 = vrsqrtss_avx(auVar160,auVar160);
    fVar67 = auVar161._0_4_;
    fVar100 = auVar157._0_4_;
    auVar157 = vdpps_avx(auVar112,auVar19,0x7f);
    fVar100 = fVar100 * 1.5 + fVar100 * fVar67 * -0.5 * fVar100 * fVar100;
    auVar113._0_4_ = fVar67 * auVar19._0_4_;
    auVar113._4_4_ = fVar67 * auVar19._4_4_;
    auVar113._8_4_ = fVar67 * auVar19._8_4_;
    auVar113._12_4_ = fVar67 * auVar19._12_4_;
    fVar67 = auVar157._0_4_;
    auVar133._0_4_ = fVar67 * auVar112._0_4_;
    auVar133._4_4_ = fVar67 * auVar112._4_4_;
    auVar133._8_4_ = fVar67 * auVar112._8_4_;
    auVar133._12_4_ = fVar67 * auVar112._12_4_;
    auVar157 = vsubps_avx(auVar113,auVar133);
    auVar160 = vrcpss_avx(auVar160,auVar160);
    auVar161 = vfnmadd213ss_fma(auVar161,auVar160,ZEXT416(0x40000000));
    fVar67 = auVar160._0_4_ * auVar161._0_4_;
    fVar142 = auVar112._0_4_ * fVar100;
    fVar164 = auVar112._4_4_ * fVar100;
    fVar165 = auVar112._8_4_ * fVar100;
    fVar166 = auVar112._12_4_ * fVar100;
    auVar160 = vshufps_avx(auVar291,auVar291,0xff);
    auVar161 = vshufps_avx(auVar20,auVar20,0xff);
    auVar203._0_4_ = fVar243 * auVar161._0_4_;
    auVar203._4_4_ = fVar257 * auVar161._4_4_;
    auVar203._8_4_ = fVar258 * auVar161._8_4_;
    auVar203._12_4_ = fVar259 * auVar161._12_4_;
    auVar114._0_4_ = fVar243 * auVar160._0_4_ + fVar66 * fVar144 * auVar18._0_4_ * auVar161._0_4_;
    auVar114._4_4_ = fVar257 * auVar160._4_4_ + fVar66 * fVar144 * auVar18._4_4_ * auVar161._4_4_;
    auVar114._8_4_ = fVar258 * auVar160._8_4_ + fVar66 * fVar144 * auVar18._8_4_ * auVar161._8_4_;
    auVar114._12_4_ =
         fVar259 * auVar160._12_4_ + fVar66 * fVar144 * auVar18._12_4_ * auVar161._12_4_;
    auVar18 = vsubps_avx(auVar20,auVar203);
    local_5b8._0_4_ = auVar20._0_4_ + auVar203._0_4_;
    local_5b8._4_4_ = auVar20._4_4_ + auVar203._4_4_;
    fStack_5b0 = auVar20._8_4_ + auVar203._8_4_;
    fStack_5ac = auVar20._12_4_ + auVar203._12_4_;
    auVar19 = vsubps_avx(auVar291,auVar114);
    auVar160 = vshufps_avx(auVar70,auVar70,0xff);
    auVar161 = vshufps_avx(auVar147,auVar147,0xff);
    auVar149._0_4_ = auVar161._0_4_ * fVar142;
    auVar149._4_4_ = auVar161._4_4_ * fVar164;
    auVar149._8_4_ = auVar161._8_4_ * fVar165;
    auVar149._12_4_ = auVar161._12_4_ * fVar166;
    auVar185._0_4_ = auVar160._0_4_ * fVar142 + auVar161._0_4_ * fVar100 * auVar157._0_4_ * fVar67;
    auVar185._4_4_ = auVar160._4_4_ * fVar164 + auVar161._4_4_ * fVar100 * auVar157._4_4_ * fVar67;
    auVar185._8_4_ = auVar160._8_4_ * fVar165 + auVar161._8_4_ * fVar100 * auVar157._8_4_ * fVar67;
    auVar185._12_4_ =
         auVar160._12_4_ * fVar166 + auVar161._12_4_ * fVar100 * auVar157._12_4_ * fVar67;
    auVar157 = vsubps_avx(auVar147,auVar149);
    local_558._4_4_ = auVar147._4_4_ + auVar149._4_4_;
    local_558._0_4_ = auVar147._0_4_ + auVar149._0_4_;
    fStack_550 = auVar147._8_4_ + auVar149._8_4_;
    fStack_54c = auVar147._12_4_ + auVar149._12_4_;
    auVar112 = vsubps_avx(auVar70,auVar185);
    auVar77._8_4_ = 0x80000000;
    auVar77._0_8_ = 0x8000000080000000;
    auVar77._12_4_ = 0x80000000;
    local_598 = auVar55._0_4_;
    fStack_594 = auVar55._4_4_;
    fStack_590 = auVar55._8_4_;
    auVar150._0_4_ = local_598 * -0.0;
    auVar150._4_4_ = fStack_594 * -0.0;
    auVar150._8_4_ = fStack_590 * -0.0;
    auVar150._12_4_ = fVar143 * -0.0;
    auVar160 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar17,auVar150);
    auVar225._0_4_ = auVar17._0_4_ + auVar150._0_4_;
    auVar225._4_4_ = auVar17._4_4_ + auVar150._4_4_;
    auVar225._8_4_ = auVar17._8_4_ + auVar150._8_4_;
    auVar225._12_4_ = auVar17._12_4_ + auVar150._12_4_;
    auVar321._0_4_ = auVar16._0_4_ + auVar160._0_4_;
    auVar321._4_4_ = auVar16._4_4_ + auVar160._4_4_;
    auVar321._8_4_ = auVar16._8_4_ + auVar160._8_4_;
    auVar321._12_4_ = auVar16._12_4_ + auVar160._12_4_;
    auVar161 = vfmadd231ps_fma(auVar225,auVar16,ZEXT816(0) << 0x20);
    auVar20 = vfmadd231ps_fma(auVar321,auVar186,auVar77);
    auVar17 = vpermilps_avx(auVar105,0xc9);
    auVar160 = vdpps_avx(auVar17,auVar17,0x7f);
    auVar147 = vfmadd231ps_fma(auVar161,auVar186,auVar77);
    fVar100 = auVar160._0_4_;
    auVar186 = ZEXT416((uint)fVar100);
    auVar161 = vrsqrtss_avx(auVar186,auVar186);
    fVar66 = auVar161._0_4_;
    fVar66 = fVar100 * -0.5 * fVar66 * fVar66 * fVar66 + fVar66 * 1.5;
    auVar161 = vpermilps_avx(auVar106,0xc9);
    auVar263._0_4_ = fVar100 * auVar161._0_4_;
    auVar263._4_4_ = fVar100 * auVar161._4_4_;
    auVar263._8_4_ = fVar100 * auVar161._8_4_;
    auVar263._12_4_ = fVar100 * auVar161._12_4_;
    auVar161 = vdpps_avx(auVar17,auVar161,0x7f);
    fVar100 = auVar161._0_4_;
    auVar248._0_4_ = fVar100 * auVar17._0_4_;
    auVar248._4_4_ = fVar100 * auVar17._4_4_;
    auVar248._8_4_ = fVar100 * auVar17._8_4_;
    auVar248._12_4_ = fVar100 * auVar17._12_4_;
    auVar16 = vsubps_avx(auVar263,auVar248);
    auVar161 = vrcpss_avx(auVar186,auVar186);
    auVar160 = vfnmadd213ss_fma(auVar160,auVar161,SUB6416(ZEXT464(0x40000000),0));
    fVar144 = auVar161._0_4_ * auVar160._0_4_;
    fVar143 = auVar17._0_4_ * fVar66;
    fVar142 = auVar17._4_4_ * fVar66;
    fVar164 = auVar17._8_4_ * fVar66;
    fVar165 = auVar17._12_4_ * fVar66;
    auVar186 = vpermilps_avx(auVar129,0xc9);
    auVar160 = vdpps_avx(auVar186,auVar186,0x7f);
    fVar67 = auVar160._0_4_;
    auVar70 = ZEXT416((uint)fVar67);
    auVar161 = vrsqrtss_avx(auVar70,auVar70);
    fVar100 = auVar161._0_4_;
    auVar17 = vpermilps_avx(auVar130,0xc9);
    auVar161 = vdpps_avx(auVar186,auVar17,0x7f);
    fVar100 = fVar100 * 1.5 + fVar67 * -0.5 * fVar100 * fVar100 * fVar100;
    auVar297._0_4_ = fVar67 * auVar17._0_4_;
    auVar297._4_4_ = fVar67 * auVar17._4_4_;
    auVar297._8_4_ = fVar67 * auVar17._8_4_;
    auVar297._12_4_ = fVar67 * auVar17._12_4_;
    fVar67 = auVar161._0_4_;
    auVar78._0_4_ = fVar67 * auVar186._0_4_;
    auVar78._4_4_ = fVar67 * auVar186._4_4_;
    auVar78._8_4_ = fVar67 * auVar186._8_4_;
    auVar78._12_4_ = fVar67 * auVar186._12_4_;
    auVar17 = vsubps_avx(auVar297,auVar78);
    auVar161 = vrcpss_avx(auVar70,auVar70);
    auVar160 = vfnmadd213ss_fma(auVar160,auVar161,SUB6416(ZEXT464(0x40000000),0));
    fVar67 = auVar161._0_4_ * auVar160._0_4_;
    fVar166 = auVar186._0_4_ * fVar100;
    fVar243 = auVar186._4_4_ * fVar100;
    fVar257 = auVar186._8_4_ * fVar100;
    fVar258 = auVar186._12_4_ * fVar100;
    auVar160 = vshufps_avx(auVar131,auVar131,0xff);
    auVar161 = vshufps_avx(auVar20,auVar20,0xff);
    auVar151._0_4_ = auVar161._0_4_ * fVar143;
    auVar151._4_4_ = auVar161._4_4_ * fVar142;
    auVar151._8_4_ = auVar161._8_4_ * fVar164;
    auVar151._12_4_ = auVar161._12_4_ * fVar165;
    auVar170._0_4_ = auVar160._0_4_ * fVar143 + auVar161._0_4_ * fVar66 * auVar16._0_4_ * fVar144;
    auVar170._4_4_ = auVar160._4_4_ * fVar142 + auVar161._4_4_ * fVar66 * auVar16._4_4_ * fVar144;
    auVar170._8_4_ = auVar160._8_4_ * fVar164 + auVar161._8_4_ * fVar66 * auVar16._8_4_ * fVar144;
    auVar170._12_4_ =
         auVar160._12_4_ * fVar165 + auVar161._12_4_ * fVar66 * auVar16._12_4_ * fVar144;
    auVar16 = vsubps_avx(auVar20,auVar151);
    fVar144 = auVar20._0_4_ + auVar151._0_4_;
    fVar143 = auVar20._4_4_ + auVar151._4_4_;
    fVar142 = auVar20._8_4_ + auVar151._8_4_;
    fVar164 = auVar20._12_4_ + auVar151._12_4_;
    auVar186 = vsubps_avx(auVar131,auVar170);
    auVar160 = vshufps_avx(auVar132,auVar132,0xff);
    auVar161 = vshufps_avx(auVar147,auVar147,0xff);
    auVar249._0_4_ = fVar166 * auVar161._0_4_;
    auVar249._4_4_ = fVar243 * auVar161._4_4_;
    auVar249._8_4_ = fVar257 * auVar161._8_4_;
    auVar249._12_4_ = fVar258 * auVar161._12_4_;
    auVar79._0_4_ = fVar166 * auVar160._0_4_ + auVar161._0_4_ * fVar100 * auVar17._0_4_ * fVar67;
    auVar79._4_4_ = fVar243 * auVar160._4_4_ + auVar161._4_4_ * fVar100 * auVar17._4_4_ * fVar67;
    auVar79._8_4_ = fVar257 * auVar160._8_4_ + auVar161._8_4_ * fVar100 * auVar17._8_4_ * fVar67;
    auVar79._12_4_ = fVar258 * auVar160._12_4_ + auVar161._12_4_ * fVar100 * auVar17._12_4_ * fVar67
    ;
    auVar160 = vsubps_avx(auVar147,auVar249);
    auVar171._0_4_ = auVar249._0_4_ + auVar147._0_4_;
    auVar171._4_4_ = auVar249._4_4_ + auVar147._4_4_;
    auVar171._8_4_ = auVar249._8_4_ + auVar147._8_4_;
    auVar171._12_4_ = auVar249._12_4_ + auVar147._12_4_;
    auVar161 = vsubps_avx(auVar132,auVar79);
    local_578._0_4_ = auVar19._0_4_;
    local_578._4_4_ = auVar19._4_4_;
    uStack_570._0_4_ = auVar19._8_4_;
    uStack_570._4_4_ = auVar19._12_4_;
    auVar80._0_4_ = auVar18._0_4_ + (float)local_578._0_4_ * 0.33333334;
    auVar80._4_4_ = auVar18._4_4_ + (float)local_578._4_4_ * 0.33333334;
    auVar80._8_4_ = auVar18._8_4_ + (float)uStack_570 * 0.33333334;
    auVar80._12_4_ = auVar18._12_4_ + uStack_570._4_4_ * 0.33333334;
    fVar66 = 1.0 - fVar101;
    auVar226._4_4_ = fVar66;
    auVar226._0_4_ = fVar66;
    auVar226._8_4_ = fVar66;
    auVar226._12_4_ = fVar66;
    auVar298._0_4_ = fVar101 * auVar16._0_4_;
    auVar298._4_4_ = fVar101 * auVar16._4_4_;
    auVar298._8_4_ = fVar101 * auVar16._8_4_;
    auVar298._12_4_ = fVar101 * auVar16._12_4_;
    local_3c8 = vfmadd231ps_fma(auVar298,auVar226,auVar18);
    auVar134._0_4_ = fVar101 * (auVar16._0_4_ + auVar186._0_4_ * 0.33333334);
    auVar134._4_4_ = fVar101 * (auVar16._4_4_ + auVar186._4_4_ * 0.33333334);
    auVar134._8_4_ = fVar101 * (auVar16._8_4_ + auVar186._8_4_ * 0.33333334);
    auVar134._12_4_ = fVar101 * (auVar16._12_4_ + auVar186._12_4_ * 0.33333334);
    auVar19 = vfmadd231ps_fma(auVar134,auVar226,auVar80);
    local_608._0_4_ = auVar112._0_4_;
    local_608._4_4_ = auVar112._4_4_;
    uStack_600._0_4_ = auVar112._8_4_;
    uStack_600._4_4_ = auVar112._12_4_;
    auVar81._0_4_ = (float)local_608._0_4_ * 0.33333334;
    auVar81._4_4_ = (float)local_608._4_4_ * 0.33333334;
    auVar81._8_4_ = (float)uStack_600 * 0.33333334;
    auVar81._12_4_ = uStack_600._4_4_ * 0.33333334;
    auVar16 = vsubps_avx(auVar157,auVar81);
    auVar308._0_4_ = (float)local_5b8._0_4_ + (fVar242 + auVar114._0_4_) * 0.33333334;
    auVar308._4_4_ = (float)local_5b8._4_4_ + (fVar260 + auVar114._4_4_) * 0.33333334;
    auVar308._8_4_ = fStack_5b0 + (fVar273 + auVar114._8_4_) * 0.33333334;
    auVar308._12_4_ = fStack_5ac + (fVar102 + auVar114._12_4_) * 0.33333334;
    auVar290._0_4_ = (fVar238 + auVar185._0_4_) * 0.33333334;
    auVar290._4_4_ = (fVar239 + auVar185._4_4_) * 0.33333334;
    auVar290._8_4_ = (fVar240 + auVar185._8_4_) * 0.33333334;
    auVar290._12_4_ = (fVar241 + auVar185._12_4_) * 0.33333334;
    auVar17 = vsubps_avx(_local_558,auVar290);
    auVar276._0_4_ = auVar161._0_4_ * 0.33333334;
    auVar276._4_4_ = auVar161._4_4_ * 0.33333334;
    auVar276._8_4_ = auVar161._8_4_ * 0.33333334;
    auVar276._12_4_ = auVar161._12_4_ * 0.33333334;
    auVar161 = vsubps_avx(auVar160,auVar276);
    auVar250._0_4_ = (fVar329 + auVar79._0_4_) * 0.33333334;
    auVar250._4_4_ = (fVar337 + auVar79._4_4_) * 0.33333334;
    auVar250._8_4_ = (fVar338 + auVar79._8_4_) * 0.33333334;
    auVar250._12_4_ = (fVar339 + auVar79._12_4_) * 0.33333334;
    auVar186 = vsubps_avx(auVar171,auVar250);
    auVar277._0_4_ = fVar101 * auVar161._0_4_;
    auVar277._4_4_ = fVar101 * auVar161._4_4_;
    auVar277._8_4_ = fVar101 * auVar161._8_4_;
    auVar277._12_4_ = fVar101 * auVar161._12_4_;
    auVar204._0_4_ = fVar101 * auVar160._0_4_;
    auVar204._4_4_ = fVar101 * auVar160._4_4_;
    auVar204._8_4_ = fVar101 * auVar160._8_4_;
    auVar204._12_4_ = fVar101 * auVar160._12_4_;
    local_3d8 = vfmadd231ps_fma(auVar277,auVar226,auVar16);
    auVar112 = vfmadd231ps_fma(auVar204,auVar226,auVar157);
    auVar82._0_4_ = fVar101 * fVar144;
    auVar82._4_4_ = fVar101 * fVar143;
    auVar82._8_4_ = fVar101 * fVar142;
    auVar82._12_4_ = fVar101 * fVar164;
    auVar115._0_4_ = fVar101 * (fVar144 + (fVar218 + auVar170._0_4_) * 0.33333334);
    auVar115._4_4_ = fVar101 * (fVar143 + (fVar219 + auVar170._4_4_) * 0.33333334);
    auVar115._8_4_ = fVar101 * (fVar142 + (fVar236 + auVar170._8_4_) * 0.33333334);
    auVar115._12_4_ = fVar101 * (fVar164 + (fVar237 + auVar170._12_4_) * 0.33333334);
    auVar152._0_4_ = fVar101 * auVar186._0_4_;
    auVar152._4_4_ = fVar101 * auVar186._4_4_;
    auVar152._8_4_ = fVar101 * auVar186._8_4_;
    auVar152._12_4_ = fVar101 * auVar186._12_4_;
    auVar172._0_4_ = fVar101 * auVar171._0_4_;
    auVar172._4_4_ = fVar101 * auVar171._4_4_;
    auVar172._8_4_ = fVar101 * auVar171._8_4_;
    auVar172._12_4_ = fVar101 * auVar171._12_4_;
    _local_3e8 = vfmadd231ps_fma(auVar82,auVar226,_local_5b8);
    auVar20 = vfmadd231ps_fma(auVar115,auVar226,auVar308);
    auVar132 = vfmadd231ps_fma(auVar152,auVar226,auVar17);
    auVar147 = vfmadd231ps_fma(auVar172,auVar226,_local_558);
    auVar160 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar160 = vinsertps_avx(auVar160,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    local_3a8 = vsubps_avx(local_3c8,auVar160);
    auVar161 = vshufps_avx(local_3a8,local_3a8,0x55);
    auVar157 = vshufps_avx(local_3a8,local_3a8,0xaa);
    aVar5 = pre->ray_space[k].vy.field_0;
    fVar66 = pre->ray_space[k].vz.field_0.m128[0];
    fVar100 = pre->ray_space[k].vz.field_0.m128[1];
    fVar101 = pre->ray_space[k].vz.field_0.m128[2];
    fVar144 = pre->ray_space[k].vz.field_0.m128[3];
    auVar83._0_4_ = fVar66 * auVar157._0_4_;
    auVar83._4_4_ = fVar100 * auVar157._4_4_;
    auVar83._8_4_ = fVar101 * auVar157._8_4_;
    auVar83._12_4_ = fVar144 * auVar157._12_4_;
    auVar16 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar5,auVar161);
    local_3b8 = vsubps_avx(auVar19,auVar160);
    auVar161 = vshufps_avx(local_3b8,local_3b8,0x55);
    auVar157 = vshufps_avx(local_3b8,local_3b8,0xaa);
    auVar331._0_4_ = fVar66 * auVar157._0_4_;
    auVar331._4_4_ = fVar100 * auVar157._4_4_;
    auVar331._8_4_ = fVar101 * auVar157._8_4_;
    auVar331._12_4_ = fVar144 * auVar157._12_4_;
    auVar157 = vfmadd231ps_fma(auVar331,(undefined1  [16])aVar5,auVar161);
    local_2a8 = vsubps_avx(local_3d8,auVar160);
    auVar161 = vshufps_avx(local_2a8,local_2a8,0xaa);
    auVar309._0_4_ = fVar66 * auVar161._0_4_;
    auVar309._4_4_ = fVar100 * auVar161._4_4_;
    auVar309._8_4_ = fVar101 * auVar161._8_4_;
    auVar309._12_4_ = fVar144 * auVar161._12_4_;
    auVar161 = vshufps_avx(local_2a8,local_2a8,0x55);
    auVar17 = vfmadd231ps_fma(auVar309,(undefined1  [16])aVar5,auVar161);
    local_2b8 = vsubps_avx(auVar112,auVar160);
    auVar161 = vshufps_avx(local_2b8,local_2b8,0xaa);
    auVar322._0_4_ = fVar66 * auVar161._0_4_;
    auVar322._4_4_ = fVar100 * auVar161._4_4_;
    auVar322._8_4_ = fVar101 * auVar161._8_4_;
    auVar322._12_4_ = fVar144 * auVar161._12_4_;
    auVar161 = vshufps_avx(local_2b8,local_2b8,0x55);
    auVar186 = vfmadd231ps_fma(auVar322,(undefined1  [16])aVar5,auVar161);
    local_2c8 = vsubps_avx(_local_3e8,auVar160);
    auVar161 = vshufps_avx(local_2c8,local_2c8,0xaa);
    auVar173._0_4_ = fVar66 * auVar161._0_4_;
    auVar173._4_4_ = fVar100 * auVar161._4_4_;
    auVar173._8_4_ = fVar101 * auVar161._8_4_;
    auVar173._12_4_ = fVar144 * auVar161._12_4_;
    auVar161 = vshufps_avx(local_2c8,local_2c8,0x55);
    auVar18 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar5,auVar161);
    local_2d8 = vsubps_avx(auVar20,auVar160);
    auVar161 = vshufps_avx(local_2d8,local_2d8,0xaa);
    auVar227._0_4_ = fVar66 * auVar161._0_4_;
    auVar227._4_4_ = fVar100 * auVar161._4_4_;
    auVar227._8_4_ = fVar101 * auVar161._8_4_;
    auVar227._12_4_ = fVar144 * auVar161._12_4_;
    auVar161 = vshufps_avx(local_2d8,local_2d8,0x55);
    auVar70 = vfmadd231ps_fma(auVar227,(undefined1  [16])aVar5,auVar161);
    local_2e8 = vsubps_avx(auVar132,auVar160);
    auVar161 = vshufps_avx(local_2e8,local_2e8,0xaa);
    auVar264._0_4_ = fVar66 * auVar161._0_4_;
    auVar264._4_4_ = fVar100 * auVar161._4_4_;
    auVar264._8_4_ = fVar101 * auVar161._8_4_;
    auVar264._12_4_ = fVar144 * auVar161._12_4_;
    auVar161 = vshufps_avx(local_2e8,local_2e8,0x55);
    auVar161 = vfmadd231ps_fma(auVar264,(undefined1  [16])aVar5,auVar161);
    local_2f8 = vsubps_avx(auVar147,auVar160);
    auVar160 = vshufps_avx(local_2f8,local_2f8,0xaa);
    auVar187._0_4_ = fVar66 * auVar160._0_4_;
    auVar187._4_4_ = fVar100 * auVar160._4_4_;
    auVar187._8_4_ = fVar101 * auVar160._8_4_;
    auVar187._12_4_ = fVar144 * auVar160._12_4_;
    auVar160 = vshufps_avx(local_2f8,local_2f8,0x55);
    auVar160 = vfmadd231ps_fma(auVar187,(undefined1  [16])aVar5,auVar160);
    auVar205._4_4_ = local_3a8._0_4_;
    auVar205._0_4_ = local_3a8._0_4_;
    auVar205._8_4_ = local_3a8._0_4_;
    auVar205._12_4_ = local_3a8._0_4_;
    aVar5 = pre->ray_space[k].vx.field_0;
    auVar71 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar5,auVar205);
    auVar206._4_4_ = local_3b8._0_4_;
    auVar206._0_4_ = local_3b8._0_4_;
    auVar206._8_4_ = local_3b8._0_4_;
    auVar206._12_4_ = local_3b8._0_4_;
    auVar69 = vfmadd231ps_fma(auVar157,(undefined1  [16])aVar5,auVar206);
    uVar68 = local_2a8._0_4_;
    auVar207._4_4_ = uVar68;
    auVar207._0_4_ = uVar68;
    auVar207._8_4_ = uVar68;
    auVar207._12_4_ = uVar68;
    auVar299 = vfmadd231ps_fma(auVar17,(undefined1  [16])aVar5,auVar207);
    uVar68 = local_2b8._0_4_;
    auVar208._4_4_ = uVar68;
    auVar208._0_4_ = uVar68;
    auVar208._8_4_ = uVar68;
    auVar208._12_4_ = uVar68;
    auVar104 = vfmadd231ps_fma(auVar186,(undefined1  [16])aVar5,auVar208);
    uVar68 = local_2c8._0_4_;
    auVar209._4_4_ = uVar68;
    auVar209._0_4_ = uVar68;
    auVar209._8_4_ = uVar68;
    auVar209._12_4_ = uVar68;
    auVar105 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar209);
    uVar68 = local_2d8._0_4_;
    auVar210._4_4_ = uVar68;
    auVar210._0_4_ = uVar68;
    auVar210._8_4_ = uVar68;
    auVar210._12_4_ = uVar68;
    auVar70 = vfmadd231ps_fma(auVar70,(undefined1  [16])aVar5,auVar210);
    uVar68 = local_2e8._0_4_;
    auVar211._4_4_ = uVar68;
    auVar211._0_4_ = uVar68;
    auVar211._8_4_ = uVar68;
    auVar211._12_4_ = uVar68;
    auVar106 = vfmadd231ps_fma(auVar161,(undefined1  [16])aVar5,auVar211);
    uVar68 = local_2f8._0_4_;
    auVar212._4_4_ = uVar68;
    auVar212._0_4_ = uVar68;
    auVar212._8_4_ = uVar68;
    auVar212._12_4_ = uVar68;
    auVar129 = vfmadd231ps_fma(auVar160,(undefined1  [16])aVar5,auVar212);
    auVar16 = vmovlhps_avx(auVar71,auVar105);
    auVar17 = vmovlhps_avx(auVar69,auVar70);
    auVar186 = vmovlhps_avx(auVar299,auVar106);
    auVar18 = vmovlhps_avx(auVar104,auVar129);
    auVar160 = vminps_avx(auVar16,auVar17);
    auVar161 = vminps_avx(auVar186,auVar18);
    auVar157 = vminps_avx(auVar160,auVar161);
    auVar160 = vmaxps_avx(auVar16,auVar17);
    auVar161 = vmaxps_avx(auVar186,auVar18);
    auVar160 = vmaxps_avx(auVar160,auVar161);
    auVar161 = vshufpd_avx(auVar157,auVar157,3);
    auVar157 = vminps_avx(auVar157,auVar161);
    auVar161 = vshufpd_avx(auVar160,auVar160,3);
    auVar161 = vmaxps_avx(auVar160,auVar161);
    auVar160 = vandps_avx(local_398,auVar157);
    auVar161 = vandps_avx(auVar161,local_398);
    auVar160 = vmaxps_avx(auVar160,auVar161);
    auVar161 = vmovshdup_avx(auVar160);
    auVar160 = vmaxss_avx(auVar161,auVar160);
    fVar100 = auVar160._0_4_ * 9.536743e-07;
    auVar251._8_8_ = auVar71._0_8_;
    auVar251._0_8_ = auVar71._0_8_;
    auVar278._8_8_ = auVar69._0_8_;
    auVar278._0_8_ = auVar69._0_8_;
    auVar310._0_8_ = auVar299._0_8_;
    auVar310._8_8_ = auVar310._0_8_;
    auVar323._0_8_ = auVar104._0_8_;
    auVar323._8_8_ = auVar323._0_8_;
    local_268 = fVar100;
    fStack_264 = fVar100;
    fStack_260 = fVar100;
    fStack_25c = fVar100;
    fStack_258 = fVar100;
    fStack_254 = fVar100;
    fStack_250 = fVar100;
    fStack_24c = fVar100;
    fStack_70 = -fVar100;
    local_78 = -fVar100;
    fStack_74 = -fVar100;
    fStack_6c = fStack_70;
    fStack_68 = fStack_70;
    fStack_64 = fStack_70;
    fStack_60 = fStack_70;
    fStack_5c = fStack_70;
    local_368 = uVar57;
    uStack_364 = uVar57;
    uStack_360 = uVar57;
    uStack_35c = uVar57;
    local_378 = uVar7;
    uStack_374 = uVar7;
    uStack_370 = uVar7;
    uStack_36c = uVar7;
    uVar65 = 0;
    fVar66 = *(float *)(ray + k * 4 + 0x30);
    local_278 = vsubps_avx(auVar17,auVar16);
    local_288 = vsubps_avx(auVar186,auVar17);
    local_298 = vsubps_avx(auVar18,auVar186);
    local_318 = vsubps_avx(_local_3e8,local_3c8);
    local_328 = vsubps_avx(auVar20,auVar19);
    local_338 = vsubps_avx(auVar132,local_3d8);
    _local_348 = vsubps_avx(auVar147,auVar112);
    auVar199 = ZEXT1664(ZEXT816(0x3f80000000000000));
    auVar295 = ZEXT1664(ZEXT816(0x3f80000000000000));
LAB_01734526:
    local_308 = auVar295._0_16_;
    auVar188 = auVar199._0_16_;
    auVar160 = vshufps_avx(auVar188,auVar188,0x50);
    auVar332._8_4_ = 0x3f800000;
    auVar332._0_8_ = 0x3f8000003f800000;
    auVar332._12_4_ = 0x3f800000;
    auVar335._16_4_ = 0x3f800000;
    auVar335._0_16_ = auVar332;
    auVar335._20_4_ = 0x3f800000;
    auVar335._24_4_ = 0x3f800000;
    auVar335._28_4_ = 0x3f800000;
    auVar161 = vsubps_avx(auVar332,auVar160);
    fVar101 = auVar160._0_4_;
    fVar243 = auVar105._0_4_;
    auVar84._0_4_ = fVar243 * fVar101;
    fVar144 = auVar160._4_4_;
    fVar257 = auVar105._4_4_;
    auVar84._4_4_ = fVar257 * fVar144;
    fVar67 = auVar160._8_4_;
    auVar84._8_4_ = fVar243 * fVar67;
    fVar143 = auVar160._12_4_;
    auVar84._12_4_ = fVar257 * fVar143;
    fVar258 = auVar70._0_4_;
    auVar213._0_4_ = fVar258 * fVar101;
    fVar218 = auVar70._4_4_;
    auVar213._4_4_ = fVar218 * fVar144;
    auVar213._8_4_ = fVar258 * fVar67;
    auVar213._12_4_ = fVar218 * fVar143;
    fVar219 = auVar106._0_4_;
    auVar174._0_4_ = fVar219 * fVar101;
    fVar236 = auVar106._4_4_;
    auVar174._4_4_ = fVar236 * fVar144;
    auVar174._8_4_ = fVar219 * fVar67;
    auVar174._12_4_ = fVar236 * fVar143;
    fVar260 = auVar129._0_4_;
    auVar135._0_4_ = fVar260 * fVar101;
    fVar273 = auVar129._4_4_;
    auVar135._4_4_ = fVar273 * fVar144;
    auVar135._8_4_ = fVar260 * fVar67;
    auVar135._12_4_ = fVar273 * fVar143;
    auVar69 = vfmadd231ps_fma(auVar84,auVar161,auVar251);
    auVar299 = vfmadd231ps_fma(auVar213,auVar161,auVar278);
    auVar104 = vfmadd231ps_fma(auVar174,auVar161,auVar310);
    auVar130 = vfmadd231ps_fma(auVar135,auVar323,auVar161);
    auVar160 = vmovshdup_avx(auVar295._0_16_);
    fVar101 = auVar295._0_4_;
    fStack_120 = (auVar160._0_4_ - fVar101) * 0.04761905;
    auVar272._4_4_ = fVar101;
    auVar272._0_4_ = fVar101;
    auVar272._8_4_ = fVar101;
    auVar272._12_4_ = fVar101;
    auVar272._16_4_ = fVar101;
    auVar272._20_4_ = fVar101;
    auVar272._24_4_ = fVar101;
    auVar272._28_4_ = fVar101;
    auVar125._0_8_ = auVar160._0_8_;
    auVar125._8_8_ = auVar125._0_8_;
    auVar125._16_8_ = auVar125._0_8_;
    auVar125._24_8_ = auVar125._0_8_;
    auVar97 = vsubps_avx(auVar125,auVar272);
    uVar68 = auVar69._0_4_;
    auVar327._4_4_ = uVar68;
    auVar327._0_4_ = uVar68;
    auVar327._8_4_ = uVar68;
    auVar327._12_4_ = uVar68;
    auVar327._16_4_ = uVar68;
    auVar327._20_4_ = uVar68;
    auVar327._24_4_ = uVar68;
    auVar327._28_4_ = uVar68;
    auVar160 = vmovshdup_avx(auVar69);
    uVar103 = auVar160._0_8_;
    auVar318._8_8_ = uVar103;
    auVar318._0_8_ = uVar103;
    auVar318._16_8_ = uVar103;
    auVar318._24_8_ = uVar103;
    fVar259 = auVar299._0_4_;
    auVar304._4_4_ = fVar259;
    auVar304._0_4_ = fVar259;
    auVar304._8_4_ = fVar259;
    auVar304._12_4_ = fVar259;
    auVar304._16_4_ = fVar259;
    auVar304._20_4_ = fVar259;
    auVar304._24_4_ = fVar259;
    auVar304._28_4_ = fVar259;
    auVar161 = vmovshdup_avx(auVar299);
    auVar126._0_8_ = auVar161._0_8_;
    auVar126._8_8_ = auVar126._0_8_;
    auVar126._16_8_ = auVar126._0_8_;
    auVar126._24_8_ = auVar126._0_8_;
    fVar166 = auVar104._0_4_;
    auVar233._4_4_ = fVar166;
    auVar233._0_4_ = fVar166;
    auVar233._8_4_ = fVar166;
    auVar233._12_4_ = fVar166;
    auVar233._16_4_ = fVar166;
    auVar233._20_4_ = fVar166;
    auVar233._24_4_ = fVar166;
    auVar233._28_4_ = fVar166;
    auVar157 = vmovshdup_avx(auVar104);
    auVar255._0_8_ = auVar157._0_8_;
    auVar255._8_8_ = auVar255._0_8_;
    auVar255._16_8_ = auVar255._0_8_;
    auVar255._24_8_ = auVar255._0_8_;
    fVar165 = auVar130._0_4_;
    auVar71 = vmovshdup_avx(auVar130);
    auVar291 = vfmadd132ps_fma(auVar97,auVar272,_DAT_01faff20);
    auVar97 = vsubps_avx(auVar335,ZEXT1632(auVar291));
    fVar101 = auVar291._0_4_;
    fVar144 = auVar291._4_4_;
    auVar21._4_4_ = fVar259 * fVar144;
    auVar21._0_4_ = fVar259 * fVar101;
    fVar67 = auVar291._8_4_;
    auVar21._8_4_ = fVar259 * fVar67;
    fVar143 = auVar291._12_4_;
    auVar21._12_4_ = fVar259 * fVar143;
    auVar21._16_4_ = fVar259 * 0.0;
    auVar21._20_4_ = fVar259 * 0.0;
    auVar21._24_4_ = fVar259 * 0.0;
    auVar21._28_4_ = 0x3f800000;
    auVar291 = vfmadd231ps_fma(auVar21,auVar97,auVar327);
    fVar142 = auVar161._0_4_;
    fVar164 = auVar161._4_4_;
    auVar22._4_4_ = fVar164 * fVar144;
    auVar22._0_4_ = fVar142 * fVar101;
    auVar22._8_4_ = fVar142 * fVar67;
    auVar22._12_4_ = fVar164 * fVar143;
    auVar22._16_4_ = fVar142 * 0.0;
    auVar22._20_4_ = fVar164 * 0.0;
    auVar22._24_4_ = fVar142 * 0.0;
    auVar22._28_4_ = uVar68;
    auVar131 = vfmadd231ps_fma(auVar22,auVar97,auVar318);
    auVar23._4_4_ = fVar166 * fVar144;
    auVar23._0_4_ = fVar166 * fVar101;
    auVar23._8_4_ = fVar166 * fVar67;
    auVar23._12_4_ = fVar166 * fVar143;
    auVar23._16_4_ = fVar166 * 0.0;
    auVar23._20_4_ = fVar166 * 0.0;
    auVar23._24_4_ = fVar166 * 0.0;
    auVar23._28_4_ = auVar160._4_4_;
    auVar167 = vfmadd231ps_fma(auVar23,auVar97,auVar304);
    fVar142 = auVar157._0_4_;
    fVar164 = auVar157._4_4_;
    auVar15._4_4_ = fVar164 * fVar144;
    auVar15._0_4_ = fVar142 * fVar101;
    auVar15._8_4_ = fVar142 * fVar67;
    auVar15._12_4_ = fVar164 * fVar143;
    auVar15._16_4_ = fVar142 * 0.0;
    auVar15._20_4_ = fVar164 * 0.0;
    auVar15._24_4_ = fVar142 * 0.0;
    auVar15._28_4_ = fVar259;
    auVar154 = vfmadd231ps_fma(auVar15,auVar97,auVar126);
    auVar160 = vshufps_avx(auVar69,auVar69,0xaa);
    uStack_570 = auVar160._0_8_;
    local_578 = (undefined1  [8])uStack_570;
    uStack_568 = uStack_570;
    uStack_560 = uStack_570;
    auVar161 = vshufps_avx(auVar69,auVar69,0xff);
    uStack_600 = auVar161._0_8_;
    local_608 = (undefined1  [8])uStack_600;
    uStack_5f8 = uStack_600;
    uStack_5f0 = uStack_600;
    auVar24._4_4_ = fVar165 * fVar144;
    auVar24._0_4_ = fVar165 * fVar101;
    auVar24._8_4_ = fVar165 * fVar67;
    auVar24._12_4_ = fVar165 * fVar143;
    auVar24._16_4_ = fVar165 * 0.0;
    auVar24._20_4_ = fVar165 * 0.0;
    auVar24._24_4_ = fVar165 * 0.0;
    auVar24._28_4_ = fVar165;
    auVar69 = vfmadd231ps_fma(auVar24,auVar97,auVar233);
    auVar161 = vshufps_avx(auVar299,auVar299,0xaa);
    auVar234._0_8_ = auVar161._0_8_;
    auVar234._8_8_ = auVar234._0_8_;
    auVar234._16_8_ = auVar234._0_8_;
    auVar234._24_8_ = auVar234._0_8_;
    auVar157 = vshufps_avx(auVar299,auVar299,0xff);
    local_508._8_8_ = auVar157._0_8_;
    local_508._0_8_ = local_508._8_8_;
    local_508._16_8_ = local_508._8_8_;
    local_508._24_8_ = local_508._8_8_;
    fVar142 = auVar71._0_4_;
    fVar164 = auVar71._4_4_;
    auVar25._4_4_ = fVar164 * fVar144;
    auVar25._0_4_ = fVar142 * fVar101;
    auVar25._8_4_ = fVar142 * fVar67;
    auVar25._12_4_ = fVar164 * fVar143;
    auVar25._16_4_ = fVar142 * 0.0;
    auVar25._20_4_ = fVar164 * 0.0;
    auVar25._24_4_ = fVar142 * 0.0;
    auVar25._28_4_ = auVar160._4_4_;
    auVar200 = vfmadd231ps_fma(auVar25,auVar97,auVar255);
    auVar26._28_4_ = fVar164;
    auVar26._0_28_ =
         ZEXT1628(CONCAT412(auVar167._12_4_ * fVar143,
                            CONCAT48(auVar167._8_4_ * fVar67,
                                     CONCAT44(auVar167._4_4_ * fVar144,auVar167._0_4_ * fVar101))));
    auVar291 = vfmadd231ps_fma(auVar26,auVar97,ZEXT1632(auVar291));
    fVar142 = auVar157._4_4_;
    auVar27._28_4_ = fVar142;
    auVar27._0_28_ =
         ZEXT1628(CONCAT412(auVar154._12_4_ * fVar143,
                            CONCAT48(auVar154._8_4_ * fVar67,
                                     CONCAT44(auVar154._4_4_ * fVar144,auVar154._0_4_ * fVar101))));
    auVar131 = vfmadd231ps_fma(auVar27,auVar97,ZEXT1632(auVar131));
    auVar160 = vshufps_avx(auVar104,auVar104,0xaa);
    uVar103 = auVar160._0_8_;
    auVar217._8_8_ = uVar103;
    auVar217._0_8_ = uVar103;
    auVar217._16_8_ = uVar103;
    auVar217._24_8_ = uVar103;
    auVar71 = vshufps_avx(auVar104,auVar104,0xff);
    uVar103 = auVar71._0_8_;
    auVar336._8_8_ = uVar103;
    auVar336._0_8_ = uVar103;
    auVar336._16_8_ = uVar103;
    auVar336._24_8_ = uVar103;
    auVar104 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar69._12_4_ * fVar143,
                                                  CONCAT48(auVar69._8_4_ * fVar67,
                                                           CONCAT44(auVar69._4_4_ * fVar144,
                                                                    auVar69._0_4_ * fVar101)))),
                               auVar97,ZEXT1632(auVar167));
    auVar69 = vshufps_avx(auVar130,auVar130,0xaa);
    auVar299 = vshufps_avx(auVar130,auVar130,0xff);
    auVar130 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar200._12_4_,
                                                  CONCAT48(fVar67 * auVar200._8_4_,
                                                           CONCAT44(fVar144 * auVar200._4_4_,
                                                                    fVar101 * auVar200._0_4_)))),
                               auVar97,ZEXT1632(auVar154));
    auVar167 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar104._12_4_,
                                                  CONCAT48(fVar67 * auVar104._8_4_,
                                                           CONCAT44(fVar144 * auVar104._4_4_,
                                                                    fVar101 * auVar104._0_4_)))),
                               auVar97,ZEXT1632(auVar291));
    auVar21 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar291));
    auVar104 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar130._12_4_,
                                                  CONCAT48(fVar67 * auVar130._8_4_,
                                                           CONCAT44(fVar144 * auVar130._4_4_,
                                                                    fVar101 * auVar130._0_4_)))),
                               auVar97,ZEXT1632(auVar131));
    auVar22 = vsubps_avx(ZEXT1632(auVar130),ZEXT1632(auVar131));
    fStack_45c = auVar22._28_4_;
    auVar305._0_4_ = fStack_120 * auVar21._0_4_ * 3.0;
    auVar305._4_4_ = fStack_120 * auVar21._4_4_ * 3.0;
    auVar305._8_4_ = fStack_120 * auVar21._8_4_ * 3.0;
    auVar305._12_4_ = fStack_120 * auVar21._12_4_ * 3.0;
    auVar305._16_4_ = fStack_120 * auVar21._16_4_ * 3.0;
    auVar305._20_4_ = fStack_120 * auVar21._20_4_ * 3.0;
    auVar305._24_4_ = fStack_120 * auVar21._24_4_ * 3.0;
    auVar305._28_4_ = 0;
    local_478._0_4_ = fStack_120 * auVar22._0_4_ * 3.0;
    local_478._4_4_ = fStack_120 * auVar22._4_4_ * 3.0;
    fStack_470 = fStack_120 * auVar22._8_4_ * 3.0;
    fStack_46c = fStack_120 * auVar22._12_4_ * 3.0;
    fStack_468 = fStack_120 * auVar22._16_4_ * 3.0;
    fStack_464 = fStack_120 * auVar22._20_4_ * 3.0;
    fStack_460 = fStack_120 * auVar22._24_4_ * 3.0;
    fVar164 = auVar161._0_4_;
    fVar165 = auVar161._4_4_;
    auVar306._4_4_ = fVar165 * fVar144;
    auVar306._0_4_ = fVar164 * fVar101;
    auVar306._8_4_ = fVar164 * fVar67;
    auVar306._12_4_ = fVar165 * fVar143;
    auVar306._16_4_ = fVar164 * 0.0;
    auVar306._20_4_ = fVar165 * 0.0;
    auVar306._24_4_ = fVar164 * 0.0;
    auVar306._28_4_ = fStack_45c;
    auVar161 = vfmadd231ps_fma(auVar306,auVar97,_local_578);
    fVar164 = auVar157._0_4_;
    auVar29._4_4_ = fVar142 * fVar144;
    auVar29._0_4_ = fVar164 * fVar101;
    auVar29._8_4_ = fVar164 * fVar67;
    auVar29._12_4_ = fVar142 * fVar143;
    auVar29._16_4_ = fVar164 * 0.0;
    auVar29._20_4_ = fVar142 * 0.0;
    auVar29._24_4_ = fVar164 * 0.0;
    auVar29._28_4_ = 0;
    auVar157 = vfmadd231ps_fma(auVar29,auVar97,_local_608);
    fVar142 = auVar160._0_4_;
    fVar164 = auVar160._4_4_;
    auVar30._4_4_ = fVar164 * fVar144;
    auVar30._0_4_ = fVar142 * fVar101;
    auVar30._8_4_ = fVar142 * fVar67;
    auVar30._12_4_ = fVar164 * fVar143;
    auVar30._16_4_ = fVar142 * 0.0;
    auVar30._20_4_ = fVar164 * 0.0;
    auVar30._24_4_ = fVar142 * 0.0;
    auVar30._28_4_ = auVar21._28_4_;
    auVar160 = vfmadd231ps_fma(auVar30,auVar97,auVar234);
    fVar142 = auVar71._0_4_;
    fVar166 = auVar71._4_4_;
    auVar31._4_4_ = fVar166 * fVar144;
    auVar31._0_4_ = fVar142 * fVar101;
    auVar31._8_4_ = fVar142 * fVar67;
    auVar31._12_4_ = fVar166 * fVar143;
    auVar31._16_4_ = fVar142 * 0.0;
    auVar31._20_4_ = fVar166 * 0.0;
    auVar31._24_4_ = fVar142 * 0.0;
    auVar31._28_4_ = fVar165;
    auVar71 = vfmadd231ps_fma(auVar31,auVar97,local_508);
    auVar24 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar167));
    fVar142 = auVar69._0_4_;
    fVar164 = auVar69._4_4_;
    auVar32._4_4_ = fVar164 * fVar144;
    auVar32._0_4_ = fVar142 * fVar101;
    auVar32._8_4_ = fVar142 * fVar67;
    auVar32._12_4_ = fVar164 * fVar143;
    auVar32._16_4_ = fVar142 * 0.0;
    auVar32._20_4_ = fVar164 * 0.0;
    auVar32._24_4_ = fVar142 * 0.0;
    auVar32._28_4_ = fVar164;
    auVar69 = vfmadd231ps_fma(auVar32,auVar97,auVar217);
    auVar25 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar104));
    fVar142 = auVar299._0_4_;
    fVar164 = auVar299._4_4_;
    auVar33._4_4_ = fVar164 * fVar144;
    auVar33._0_4_ = fVar142 * fVar101;
    auVar33._8_4_ = fVar142 * fVar67;
    auVar33._12_4_ = fVar164 * fVar143;
    auVar33._16_4_ = fVar142 * 0.0;
    auVar33._20_4_ = fVar164 * 0.0;
    auVar33._24_4_ = fVar142 * 0.0;
    auVar33._28_4_ = fVar164;
    auVar299 = vfmadd231ps_fma(auVar33,auVar97,auVar336);
    auVar34._28_4_ = fVar166;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(auVar160._12_4_ * fVar143,
                            CONCAT48(auVar160._8_4_ * fVar67,
                                     CONCAT44(auVar160._4_4_ * fVar144,auVar160._0_4_ * fVar101))));
    auVar161 = vfmadd231ps_fma(auVar34,auVar97,ZEXT1632(auVar161));
    auVar157 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar71._12_4_,
                                                  CONCAT48(fVar67 * auVar71._8_4_,
                                                           CONCAT44(fVar144 * auVar71._4_4_,
                                                                    fVar101 * auVar71._0_4_)))),
                               auVar97,ZEXT1632(auVar157));
    auVar127._0_4_ = auVar167._0_4_ + auVar305._0_4_;
    auVar127._4_4_ = auVar167._4_4_ + auVar305._4_4_;
    auVar127._8_4_ = auVar167._8_4_ + auVar305._8_4_;
    auVar127._12_4_ = auVar167._12_4_ + auVar305._12_4_;
    auVar127._16_4_ = auVar305._16_4_ + 0.0;
    auVar127._20_4_ = auVar305._20_4_ + 0.0;
    auVar127._24_4_ = auVar305._24_4_ + 0.0;
    auVar127._28_4_ = 0;
    auVar160 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar69._12_4_ * fVar143,
                                                  CONCAT48(auVar69._8_4_ * fVar67,
                                                           CONCAT44(auVar69._4_4_ * fVar144,
                                                                    auVar69._0_4_ * fVar101)))),
                               auVar97,ZEXT1632(auVar160));
    auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar299._12_4_ * fVar143,
                                                 CONCAT48(auVar299._8_4_ * fVar67,
                                                          CONCAT44(auVar299._4_4_ * fVar144,
                                                                   auVar299._0_4_ * fVar101)))),
                              auVar97,ZEXT1632(auVar71));
    auVar69 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar143 * auVar160._12_4_,
                                                 CONCAT48(fVar67 * auVar160._8_4_,
                                                          CONCAT44(fVar144 * auVar160._4_4_,
                                                                   fVar101 * auVar160._0_4_)))),
                              auVar97,ZEXT1632(auVar161));
    auVar299 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar71._12_4_ * fVar143,
                                                  CONCAT48(auVar71._8_4_ * fVar67,
                                                           CONCAT44(auVar71._4_4_ * fVar144,
                                                                    auVar71._0_4_ * fVar101)))),
                               ZEXT1632(auVar157),auVar97);
    auVar97 = vsubps_avx(ZEXT1632(auVar160),ZEXT1632(auVar161));
    auVar21 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar157));
    auVar328._0_4_ = fStack_120 * auVar97._0_4_ * 3.0;
    auVar328._4_4_ = fStack_120 * auVar97._4_4_ * 3.0;
    auVar328._8_4_ = fStack_120 * auVar97._8_4_ * 3.0;
    auVar328._12_4_ = fStack_120 * auVar97._12_4_ * 3.0;
    auVar328._16_4_ = fStack_120 * auVar97._16_4_ * 3.0;
    auVar328._20_4_ = fStack_120 * auVar97._20_4_ * 3.0;
    auVar328._24_4_ = fStack_120 * auVar97._24_4_ * 3.0;
    auVar328._28_4_ = 0;
    local_138 = fStack_120 * auVar21._0_4_ * 3.0;
    fStack_134 = fStack_120 * auVar21._4_4_ * 3.0;
    auVar35._4_4_ = fStack_134;
    auVar35._0_4_ = local_138;
    fStack_130 = fStack_120 * auVar21._8_4_ * 3.0;
    auVar35._8_4_ = fStack_130;
    fStack_12c = fStack_120 * auVar21._12_4_ * 3.0;
    auVar35._12_4_ = fStack_12c;
    fStack_128 = fStack_120 * auVar21._16_4_ * 3.0;
    auVar35._16_4_ = fStack_128;
    fStack_124 = fStack_120 * auVar21._20_4_ * 3.0;
    auVar35._20_4_ = fStack_124;
    fStack_120 = fStack_120 * auVar21._24_4_ * 3.0;
    auVar35._24_4_ = fStack_120;
    auVar35._28_4_ = 0x40400000;
    auVar26 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar69));
    _local_438 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar299));
    auVar97 = vsubps_avx(ZEXT1632(auVar69),ZEXT1632(auVar167));
    auVar21 = vsubps_avx(ZEXT1632(auVar299),ZEXT1632(auVar104));
    auVar22 = vsubps_avx(auVar26,auVar24);
    fVar259 = auVar97._0_4_ + auVar22._0_4_;
    fVar237 = auVar97._4_4_ + auVar22._4_4_;
    fVar238 = auVar97._8_4_ + auVar22._8_4_;
    fVar239 = auVar97._12_4_ + auVar22._12_4_;
    fVar240 = auVar97._16_4_ + auVar22._16_4_;
    fVar241 = auVar97._20_4_ + auVar22._20_4_;
    fVar242 = auVar97._24_4_ + auVar22._24_4_;
    auVar23 = vsubps_avx(_local_438,auVar25);
    auVar98._0_4_ = auVar21._0_4_ + auVar23._0_4_;
    auVar98._4_4_ = auVar21._4_4_ + auVar23._4_4_;
    auVar98._8_4_ = auVar21._8_4_ + auVar23._8_4_;
    auVar98._12_4_ = auVar21._12_4_ + auVar23._12_4_;
    auVar98._16_4_ = auVar21._16_4_ + auVar23._16_4_;
    auVar98._20_4_ = auVar21._20_4_ + auVar23._20_4_;
    auVar98._24_4_ = auVar21._24_4_ + auVar23._24_4_;
    auVar98._28_4_ = auVar21._28_4_ + auVar23._28_4_;
    local_d8 = ZEXT1632(auVar104);
    fVar101 = auVar104._0_4_;
    local_158 = (float)local_478._0_4_ + fVar101;
    fVar144 = auVar104._4_4_;
    fStack_154 = (float)local_478._4_4_ + fVar144;
    fVar67 = auVar104._8_4_;
    fStack_150 = fStack_470 + fVar67;
    fVar143 = auVar104._12_4_;
    fStack_14c = fStack_46c + fVar143;
    fStack_148 = fStack_468 + 0.0;
    fStack_144 = fStack_464 + 0.0;
    fStack_140 = fStack_460 + 0.0;
    local_98 = ZEXT1632(auVar167);
    auVar21 = vsubps_avx(local_98,auVar305);
    local_b8 = vpermps_avx2(_DAT_01fec480,auVar21);
    auVar21 = vsubps_avx(local_d8,_local_478);
    local_178 = vpermps_avx2(_DAT_01fec480,auVar21);
    local_f8._0_4_ = auVar69._0_4_ + auVar328._0_4_;
    local_f8._4_4_ = auVar69._4_4_ + auVar328._4_4_;
    local_f8._8_4_ = auVar69._8_4_ + auVar328._8_4_;
    local_f8._12_4_ = auVar69._12_4_ + auVar328._12_4_;
    local_f8._16_4_ = auVar328._16_4_ + 0.0;
    local_f8._20_4_ = auVar328._20_4_ + 0.0;
    local_f8._24_4_ = auVar328._24_4_ + 0.0;
    local_f8._28_4_ = 0;
    auVar306 = ZEXT1632(auVar69);
    auVar21 = vsubps_avx(auVar306,auVar328);
    auVar27 = vpermps_avx2(_DAT_01fec480,auVar21);
    fVar142 = auVar299._0_4_;
    local_138 = fVar142 + local_138;
    fVar164 = auVar299._4_4_;
    fStack_134 = fVar164 + fStack_134;
    fVar165 = auVar299._8_4_;
    fStack_130 = fVar165 + fStack_130;
    fVar166 = auVar299._12_4_;
    fStack_12c = fVar166 + fStack_12c;
    fStack_128 = fStack_128 + 0.0;
    fStack_124 = fStack_124 + 0.0;
    fStack_120 = fStack_120 + 0.0;
    auVar21 = vsubps_avx(ZEXT1632(auVar299),auVar35);
    local_118 = vpermps_avx2(_DAT_01fec480,auVar21);
    auVar36._4_4_ = fVar144 * fVar237;
    auVar36._0_4_ = fVar101 * fVar259;
    auVar36._8_4_ = fVar67 * fVar238;
    auVar36._12_4_ = fVar143 * fVar239;
    auVar36._16_4_ = fVar240 * 0.0;
    auVar36._20_4_ = fVar241 * 0.0;
    auVar36._24_4_ = fVar242 * 0.0;
    auVar36._28_4_ = auVar21._28_4_;
    auVar160 = vfnmadd231ps_fma(auVar36,local_98,auVar98);
    fStack_13c = fStack_45c + 0.0;
    auVar37._4_4_ = fStack_154 * fVar237;
    auVar37._0_4_ = local_158 * fVar259;
    auVar37._8_4_ = fStack_150 * fVar238;
    auVar37._12_4_ = fStack_14c * fVar239;
    auVar37._16_4_ = fStack_148 * fVar240;
    auVar37._20_4_ = fStack_144 * fVar241;
    auVar37._24_4_ = fStack_140 * fVar242;
    auVar37._28_4_ = 0;
    auVar161 = vfnmadd231ps_fma(auVar37,auVar98,auVar127);
    auVar38._4_4_ = local_178._4_4_ * fVar237;
    auVar38._0_4_ = local_178._0_4_ * fVar259;
    auVar38._8_4_ = local_178._8_4_ * fVar238;
    auVar38._12_4_ = local_178._12_4_ * fVar239;
    auVar38._16_4_ = local_178._16_4_ * fVar240;
    auVar38._20_4_ = local_178._20_4_ * fVar241;
    auVar38._24_4_ = local_178._24_4_ * fVar242;
    auVar38._28_4_ = fStack_45c + 0.0;
    auVar157 = vfnmadd231ps_fma(auVar38,local_b8,auVar98);
    local_608._0_4_ = auVar25._0_4_;
    local_608._4_4_ = auVar25._4_4_;
    uStack_600._0_4_ = auVar25._8_4_;
    uStack_600._4_4_ = auVar25._12_4_;
    uStack_5f8._0_4_ = auVar25._16_4_;
    uStack_5f8._4_4_ = auVar25._20_4_;
    uStack_5f0._0_4_ = auVar25._24_4_;
    uStack_5f0._4_4_ = auVar25._28_4_;
    auVar39._4_4_ = (float)local_608._4_4_ * fVar237;
    auVar39._0_4_ = (float)local_608._0_4_ * fVar259;
    auVar39._8_4_ = (float)uStack_600 * fVar238;
    auVar39._12_4_ = uStack_600._4_4_ * fVar239;
    auVar39._16_4_ = (float)uStack_5f8 * fVar240;
    auVar39._20_4_ = uStack_5f8._4_4_ * fVar241;
    auVar39._24_4_ = (float)uStack_5f0 * fVar242;
    auVar39._28_4_ = uStack_5f0._4_4_;
    auVar71 = vfnmadd231ps_fma(auVar39,auVar24,auVar98);
    auVar256._0_4_ = fVar142 * fVar259;
    auVar256._4_4_ = fVar164 * fVar237;
    auVar256._8_4_ = fVar165 * fVar238;
    auVar256._12_4_ = fVar166 * fVar239;
    auVar256._16_4_ = fVar240 * 0.0;
    auVar256._20_4_ = fVar241 * 0.0;
    auVar256._24_4_ = fVar242 * 0.0;
    auVar256._28_4_ = 0;
    auVar69 = vfnmadd231ps_fma(auVar256,auVar306,auVar98);
    uStack_11c = 0x40400000;
    auVar40._4_4_ = fStack_134 * fVar237;
    auVar40._0_4_ = local_138 * fVar259;
    auVar40._8_4_ = fStack_130 * fVar238;
    auVar40._12_4_ = fStack_12c * fVar239;
    auVar40._16_4_ = fStack_128 * fVar240;
    auVar40._20_4_ = fStack_124 * fVar241;
    auVar40._24_4_ = fStack_120 * fVar242;
    auVar40._28_4_ = auVar24._28_4_;
    auVar104 = vfnmadd231ps_fma(auVar40,local_f8,auVar98);
    auVar41._4_4_ = local_118._4_4_ * fVar237;
    auVar41._0_4_ = local_118._0_4_ * fVar259;
    auVar41._8_4_ = local_118._8_4_ * fVar238;
    auVar41._12_4_ = local_118._12_4_ * fVar239;
    auVar41._16_4_ = local_118._16_4_ * fVar240;
    auVar41._20_4_ = local_118._20_4_ * fVar241;
    auVar41._24_4_ = local_118._24_4_ * fVar242;
    auVar41._28_4_ = local_118._28_4_;
    auVar130 = vfnmadd231ps_fma(auVar41,auVar27,auVar98);
    auVar42._4_4_ = local_438._4_4_ * fVar237;
    auVar42._0_4_ = local_438._0_4_ * fVar259;
    auVar42._8_4_ = local_438._8_4_ * fVar238;
    auVar42._12_4_ = local_438._12_4_ * fVar239;
    auVar42._16_4_ = local_438._16_4_ * fVar240;
    auVar42._20_4_ = local_438._20_4_ * fVar241;
    auVar42._24_4_ = local_438._24_4_ * fVar242;
    auVar42._28_4_ = auVar97._28_4_ + auVar22._28_4_;
    auVar291 = vfnmadd231ps_fma(auVar42,auVar26,auVar98);
    auVar21 = vminps_avx(ZEXT1632(auVar160),ZEXT1632(auVar161));
    auVar97 = vmaxps_avx(ZEXT1632(auVar160),ZEXT1632(auVar161));
    auVar22 = vminps_avx(ZEXT1632(auVar157),ZEXT1632(auVar71));
    auVar22 = vminps_avx(auVar21,auVar22);
    auVar21 = vmaxps_avx(ZEXT1632(auVar157),ZEXT1632(auVar71));
    auVar97 = vmaxps_avx(auVar97,auVar21);
    auVar23 = vminps_avx(ZEXT1632(auVar69),ZEXT1632(auVar104));
    auVar21 = vmaxps_avx(ZEXT1632(auVar69),ZEXT1632(auVar104));
    auVar15 = vminps_avx(ZEXT1632(auVar130),ZEXT1632(auVar291));
    auVar23 = vminps_avx(auVar23,auVar15);
    auVar23 = vminps_avx(auVar22,auVar23);
    auVar22 = vmaxps_avx(ZEXT1632(auVar130),ZEXT1632(auVar291));
    auVar21 = vmaxps_avx(auVar21,auVar22);
    auVar21 = vmaxps_avx(auVar97,auVar21);
    auVar51._4_4_ = fStack_264;
    auVar51._0_4_ = local_268;
    auVar51._8_4_ = fStack_260;
    auVar51._12_4_ = fStack_25c;
    auVar51._16_4_ = fStack_258;
    auVar51._20_4_ = fStack_254;
    auVar51._24_4_ = fStack_250;
    auVar51._28_4_ = fStack_24c;
    auVar97 = vcmpps_avx(auVar23,auVar51,2);
    auVar53._4_4_ = fStack_74;
    auVar53._0_4_ = local_78;
    auVar53._8_4_ = fStack_70;
    auVar53._12_4_ = fStack_6c;
    auVar53._16_4_ = fStack_68;
    auVar53._20_4_ = fStack_64;
    auVar53._24_4_ = fStack_60;
    auVar53._28_4_ = fStack_5c;
    auVar21 = vcmpps_avx(auVar21,auVar53,5);
    auVar97 = vandps_avx(auVar21,auVar97);
    auVar21 = local_198 & auVar97;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0x7f,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar21 >> 0xbf,0) != '\0') ||
        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar21[0x1f] < '\0')
    {
      auVar21 = vsubps_avx(auVar24,local_98);
      auVar22 = vsubps_avx(auVar26,auVar306);
      fVar237 = auVar21._0_4_ + auVar22._0_4_;
      fVar238 = auVar21._4_4_ + auVar22._4_4_;
      fVar239 = auVar21._8_4_ + auVar22._8_4_;
      fVar240 = auVar21._12_4_ + auVar22._12_4_;
      fVar241 = auVar21._16_4_ + auVar22._16_4_;
      fVar242 = auVar21._20_4_ + auVar22._20_4_;
      fVar102 = auVar21._24_4_ + auVar22._24_4_;
      auVar23 = vsubps_avx(auVar25,local_d8);
      auVar15 = vsubps_avx(_local_438,ZEXT1632(auVar299));
      auVar128._0_4_ = auVar23._0_4_ + auVar15._0_4_;
      auVar128._4_4_ = auVar23._4_4_ + auVar15._4_4_;
      auVar128._8_4_ = auVar23._8_4_ + auVar15._8_4_;
      auVar128._12_4_ = auVar23._12_4_ + auVar15._12_4_;
      auVar128._16_4_ = auVar23._16_4_ + auVar15._16_4_;
      auVar128._20_4_ = auVar23._20_4_ + auVar15._20_4_;
      auVar128._24_4_ = auVar23._24_4_ + auVar15._24_4_;
      fVar259 = auVar15._28_4_;
      auVar128._28_4_ = auVar23._28_4_ + fVar259;
      auVar43._4_4_ = fVar144 * fVar238;
      auVar43._0_4_ = fVar101 * fVar237;
      auVar43._8_4_ = fVar67 * fVar239;
      auVar43._12_4_ = fVar143 * fVar240;
      auVar43._16_4_ = fVar241 * 0.0;
      auVar43._20_4_ = fVar242 * 0.0;
      auVar43._24_4_ = fVar102 * 0.0;
      auVar43._28_4_ = auVar26._28_4_;
      auVar69 = vfnmadd231ps_fma(auVar43,auVar128,local_98);
      auVar44._4_4_ = fVar238 * fStack_154;
      auVar44._0_4_ = fVar237 * local_158;
      auVar44._8_4_ = fVar239 * fStack_150;
      auVar44._12_4_ = fVar240 * fStack_14c;
      auVar44._16_4_ = fVar241 * fStack_148;
      auVar44._20_4_ = fVar242 * fStack_144;
      auVar44._24_4_ = fVar102 * fStack_140;
      auVar44._28_4_ = 0;
      auVar160 = vfnmadd213ps_fma(auVar127,auVar128,auVar44);
      auVar45._4_4_ = fVar238 * local_178._4_4_;
      auVar45._0_4_ = fVar237 * local_178._0_4_;
      auVar45._8_4_ = fVar239 * local_178._8_4_;
      auVar45._12_4_ = fVar240 * local_178._12_4_;
      auVar45._16_4_ = fVar241 * local_178._16_4_;
      auVar45._20_4_ = fVar242 * local_178._20_4_;
      auVar45._24_4_ = fVar102 * local_178._24_4_;
      auVar45._28_4_ = 0;
      auVar161 = vfnmadd213ps_fma(local_b8,auVar128,auVar45);
      auVar46._4_4_ = (float)local_608._4_4_ * fVar238;
      auVar46._0_4_ = (float)local_608._0_4_ * fVar237;
      auVar46._8_4_ = (float)uStack_600 * fVar239;
      auVar46._12_4_ = uStack_600._4_4_ * fVar240;
      auVar46._16_4_ = (float)uStack_5f8 * fVar241;
      auVar46._20_4_ = uStack_5f8._4_4_ * fVar242;
      auVar46._24_4_ = (float)uStack_5f0 * fVar102;
      auVar46._28_4_ = 0;
      auVar299 = vfnmadd231ps_fma(auVar46,auVar128,auVar24);
      auVar162._0_4_ = fVar142 * fVar237;
      auVar162._4_4_ = fVar164 * fVar238;
      auVar162._8_4_ = fVar165 * fVar239;
      auVar162._12_4_ = fVar166 * fVar240;
      auVar162._16_4_ = fVar241 * 0.0;
      auVar162._20_4_ = fVar242 * 0.0;
      auVar162._24_4_ = fVar102 * 0.0;
      auVar162._28_4_ = 0;
      auVar104 = vfnmadd231ps_fma(auVar162,auVar128,auVar306);
      auVar47._4_4_ = fVar238 * fStack_134;
      auVar47._0_4_ = fVar237 * local_138;
      auVar47._8_4_ = fVar239 * fStack_130;
      auVar47._12_4_ = fVar240 * fStack_12c;
      auVar47._16_4_ = fVar241 * fStack_128;
      auVar47._20_4_ = fVar242 * fStack_124;
      auVar47._24_4_ = fVar102 * fStack_120;
      auVar47._28_4_ = fVar259;
      auVar157 = vfnmadd213ps_fma(local_f8,auVar128,auVar47);
      auVar48._4_4_ = fVar238 * local_118._4_4_;
      auVar48._0_4_ = fVar237 * local_118._0_4_;
      auVar48._8_4_ = fVar239 * local_118._8_4_;
      auVar48._12_4_ = fVar240 * local_118._12_4_;
      auVar48._16_4_ = fVar241 * local_118._16_4_;
      auVar48._20_4_ = fVar242 * local_118._20_4_;
      auVar48._24_4_ = fVar102 * local_118._24_4_;
      auVar48._28_4_ = fVar259;
      auVar71 = vfnmadd213ps_fma(auVar27,auVar128,auVar48);
      auVar49._4_4_ = fVar238 * local_438._4_4_;
      auVar49._0_4_ = fVar237 * local_438._0_4_;
      auVar49._8_4_ = fVar239 * local_438._8_4_;
      auVar49._12_4_ = fVar240 * local_438._12_4_;
      auVar49._16_4_ = fVar241 * local_438._16_4_;
      auVar49._20_4_ = fVar242 * local_438._20_4_;
      auVar49._24_4_ = fVar102 * local_438._24_4_;
      auVar49._28_4_ = auVar21._28_4_ + auVar22._28_4_;
      auVar130 = vfnmadd231ps_fma(auVar49,auVar128,auVar26);
      auVar22 = vminps_avx(ZEXT1632(auVar69),ZEXT1632(auVar160));
      auVar21 = vmaxps_avx(ZEXT1632(auVar69),ZEXT1632(auVar160));
      auVar23 = vminps_avx(ZEXT1632(auVar161),ZEXT1632(auVar299));
      auVar23 = vminps_avx(auVar22,auVar23);
      auVar22 = vmaxps_avx(ZEXT1632(auVar161),ZEXT1632(auVar299));
      auVar21 = vmaxps_avx(auVar21,auVar22);
      auVar15 = vminps_avx(ZEXT1632(auVar104),ZEXT1632(auVar157));
      auVar22 = vmaxps_avx(ZEXT1632(auVar104),ZEXT1632(auVar157));
      auVar24 = vminps_avx(ZEXT1632(auVar71),ZEXT1632(auVar130));
      auVar15 = vminps_avx(auVar15,auVar24);
      auVar15 = vminps_avx(auVar23,auVar15);
      auVar23 = vmaxps_avx(ZEXT1632(auVar71),ZEXT1632(auVar130));
      auVar22 = vmaxps_avx(auVar22,auVar23);
      auVar22 = vmaxps_avx(auVar21,auVar22);
      auVar52._4_4_ = fStack_264;
      auVar52._0_4_ = local_268;
      auVar52._8_4_ = fStack_260;
      auVar52._12_4_ = fStack_25c;
      auVar52._16_4_ = fStack_258;
      auVar52._20_4_ = fStack_254;
      auVar52._24_4_ = fStack_250;
      auVar52._28_4_ = fStack_24c;
      auVar21 = vcmpps_avx(auVar15,auVar52,2);
      auVar22 = vcmpps_avx(auVar22,auVar53,5);
      auVar21 = vandps_avx(auVar22,auVar21);
      auVar97 = vandps_avx(auVar97,local_198);
      auVar22 = auVar97 & auVar21;
      if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar22 >> 0x7f,0) != '\0') ||
            (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar22 >> 0xbf,0) != '\0') ||
          (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar22[0x1f] < '\0') {
        auVar97 = vandps_avx(auVar21,auVar97);
        uVar63 = vmovmskps_avx(auVar97);
        if (uVar63 != 0) {
          uVar59 = (ulong)uVar65;
          auStack_388[uVar59] = uVar63 & 0xff;
          uVar103 = vmovlps_avx(local_308);
          *(undefined8 *)(&uStack_248 + uVar59 * 2) = uVar103;
          uVar58 = vmovlps_avx(auVar188);
          auStack_58[uVar59] = uVar58;
          uVar65 = uVar65 + 1;
        }
      }
    }
    if (uVar65 != 0) {
      do {
        uVar59 = (ulong)(uVar65 - 1);
        uVar62 = auStack_388[uVar59];
        uVar63 = (&uStack_248)[uVar59 * 2];
        fVar101 = afStack_244[uVar59 * 2];
        iVar28 = 0;
        for (uVar58 = (ulong)uVar62; (uVar58 & 1) == 0; uVar58 = uVar58 >> 1 | 0x8000000000000000) {
          iVar28 = iVar28 + 1;
        }
        uVar62 = uVar62 - 1 & uVar62;
        if (uVar62 == 0) {
          uVar65 = uVar65 - 1;
        }
        auVar189._8_8_ = 0;
        auVar189._0_8_ = auStack_58[uVar59];
        auVar199 = ZEXT1664(auVar189);
        auStack_388[uVar59] = uVar62;
        fVar144 = (float)(iVar28 + 1) * 0.14285715;
        auVar160 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * (float)iVar28 * 0.14285715)),
                                   ZEXT416(uVar63),ZEXT416((uint)(1.0 - (float)iVar28 * 0.14285715))
                                  );
        auVar161 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * fVar144)),ZEXT416(uVar63),
                                   ZEXT416((uint)(1.0 - fVar144)));
        fVar144 = auVar161._0_4_;
        fVar67 = auVar160._0_4_;
        fVar101 = fVar144 - fVar67;
        if (0.16666667 <= fVar101) {
          auVar160 = vinsertps_avx(auVar160,auVar161,0x10);
          auVar295 = ZEXT1664(auVar160);
          goto LAB_01734526;
        }
        auVar157 = vshufps_avx(auVar189,auVar189,0x50);
        auVar116._8_4_ = 0x3f800000;
        auVar116._0_8_ = 0x3f8000003f800000;
        auVar116._12_4_ = 0x3f800000;
        auVar71 = vsubps_avx(auVar116,auVar157);
        fVar143 = auVar157._0_4_;
        auVar175._0_4_ = fVar143 * fVar243;
        fVar142 = auVar157._4_4_;
        auVar175._4_4_ = fVar142 * fVar257;
        fVar164 = auVar157._8_4_;
        auVar175._8_4_ = fVar164 * fVar243;
        fVar165 = auVar157._12_4_;
        auVar175._12_4_ = fVar165 * fVar257;
        auVar190._0_4_ = fVar258 * fVar143;
        auVar190._4_4_ = fVar218 * fVar142;
        auVar190._8_4_ = fVar258 * fVar164;
        auVar190._12_4_ = fVar218 * fVar165;
        auVar214._0_4_ = fVar219 * fVar143;
        auVar214._4_4_ = fVar236 * fVar142;
        auVar214._8_4_ = fVar219 * fVar164;
        auVar214._12_4_ = fVar236 * fVar165;
        auVar85._0_4_ = fVar260 * fVar143;
        auVar85._4_4_ = fVar273 * fVar142;
        auVar85._8_4_ = fVar260 * fVar164;
        auVar85._12_4_ = fVar273 * fVar165;
        auVar157 = vfmadd231ps_fma(auVar175,auVar71,auVar251);
        auVar69 = vfmadd231ps_fma(auVar190,auVar71,auVar278);
        auVar299 = vfmadd231ps_fma(auVar214,auVar71,auVar310);
        auVar71 = vfmadd231ps_fma(auVar85,auVar71,auVar323);
        auVar163._16_16_ = auVar157;
        auVar163._0_16_ = auVar157;
        auVar180._16_16_ = auVar69;
        auVar180._0_16_ = auVar69;
        auVar198._16_16_ = auVar299;
        auVar198._0_16_ = auVar299;
        auVar235._4_4_ = fVar67;
        auVar235._0_4_ = fVar67;
        auVar235._8_4_ = fVar67;
        auVar235._12_4_ = fVar67;
        auVar235._20_4_ = fVar144;
        auVar235._16_4_ = fVar144;
        auVar235._24_4_ = fVar144;
        auVar235._28_4_ = fVar144;
        auVar97 = vsubps_avx(auVar180,auVar163);
        auVar69 = vfmadd213ps_fma(auVar97,auVar235,auVar163);
        auVar97 = vsubps_avx(auVar198,auVar180);
        auVar104 = vfmadd213ps_fma(auVar97,auVar235,auVar180);
        auVar157 = vsubps_avx(auVar71,auVar299);
        auVar99._16_16_ = auVar157;
        auVar99._0_16_ = auVar157;
        auVar157 = vfmadd213ps_fma(auVar99,auVar235,auVar198);
        auVar97 = vsubps_avx(ZEXT1632(auVar104),ZEXT1632(auVar69));
        auVar71 = vfmadd213ps_fma(auVar97,auVar235,ZEXT1632(auVar69));
        auVar97 = vsubps_avx(ZEXT1632(auVar157),ZEXT1632(auVar104));
        auVar157 = vfmadd213ps_fma(auVar97,auVar235,ZEXT1632(auVar104));
        auVar97 = vsubps_avx(ZEXT1632(auVar157),ZEXT1632(auVar71));
        auVar131 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar97,auVar235);
        fVar143 = fVar101 * 0.33333334;
        auVar228._0_8_ =
             CONCAT44(auVar131._4_4_ + fVar143 * auVar97._4_4_ * 3.0,
                      auVar131._0_4_ + fVar143 * auVar97._0_4_ * 3.0);
        auVar228._8_4_ = auVar131._8_4_ + fVar143 * auVar97._8_4_ * 3.0;
        auVar228._12_4_ = auVar131._12_4_ + fVar143 * auVar97._12_4_ * 3.0;
        auVar71 = vshufpd_avx(auVar131,auVar131,3);
        auVar69 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
        _local_438 = auVar71;
        auVar157 = vsubps_avx(auVar71,auVar131);
        auVar299 = vsubps_avx(auVar69,(undefined1  [16])0x0);
        auVar86._0_4_ = auVar157._0_4_ + auVar299._0_4_;
        auVar86._4_4_ = auVar157._4_4_ + auVar299._4_4_;
        auVar86._8_4_ = auVar157._8_4_ + auVar299._8_4_;
        auVar86._12_4_ = auVar157._12_4_ + auVar299._12_4_;
        auVar157 = vshufps_avx(auVar131,auVar131,0xb1);
        auVar299 = vshufps_avx(auVar228,auVar228,0xb1);
        auVar324._4_4_ = auVar86._0_4_;
        auVar324._0_4_ = auVar86._0_4_;
        auVar324._8_4_ = auVar86._0_4_;
        auVar324._12_4_ = auVar86._0_4_;
        auVar104 = vshufps_avx(auVar86,auVar86,0x55);
        fVar142 = auVar104._0_4_;
        auVar87._0_4_ = fVar142 * auVar157._0_4_;
        fVar164 = auVar104._4_4_;
        auVar87._4_4_ = fVar164 * auVar157._4_4_;
        fVar165 = auVar104._8_4_;
        auVar87._8_4_ = fVar165 * auVar157._8_4_;
        fVar166 = auVar104._12_4_;
        auVar87._12_4_ = fVar166 * auVar157._12_4_;
        auVar191._0_4_ = fVar142 * auVar299._0_4_;
        auVar191._4_4_ = fVar164 * auVar299._4_4_;
        auVar191._8_4_ = fVar165 * auVar299._8_4_;
        auVar191._12_4_ = fVar166 * auVar299._12_4_;
        auVar130 = vfmadd231ps_fma(auVar87,auVar324,auVar131);
        auVar291 = vfmadd231ps_fma(auVar191,auVar324,auVar228);
        auVar299 = vshufps_avx(auVar130,auVar130,0xe8);
        auVar104 = vshufps_avx(auVar291,auVar291,0xe8);
        auVar157 = vcmpps_avx(auVar299,auVar104,1);
        uVar63 = vextractps_avx(auVar157,0);
        auVar167 = auVar291;
        if ((uVar63 & 1) == 0) {
          auVar167 = auVar130;
        }
        auVar153._0_4_ = fVar143 * auVar97._16_4_ * 3.0;
        auVar153._4_4_ = fVar143 * auVar97._20_4_ * 3.0;
        auVar153._8_4_ = fVar143 * auVar97._24_4_ * 3.0;
        auVar153._12_4_ = fVar143 * 0.0;
        auVar220 = vsubps_avx((undefined1  [16])0x0,auVar153);
        auVar154 = vshufps_avx(auVar220,auVar220,0xb1);
        auVar200 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
        auVar229._0_4_ = fVar142 * auVar154._0_4_;
        auVar229._4_4_ = fVar164 * auVar154._4_4_;
        auVar229._8_4_ = fVar165 * auVar154._8_4_;
        auVar229._12_4_ = fVar166 * auVar154._12_4_;
        auVar252._0_4_ = auVar200._0_4_ * fVar142;
        auVar252._4_4_ = auVar200._4_4_ * fVar164;
        auVar252._8_4_ = auVar200._8_4_ * fVar165;
        auVar252._12_4_ = auVar200._12_4_ * fVar166;
        auVar221 = vfmadd231ps_fma(auVar229,auVar324,auVar220);
        auVar244 = vfmadd231ps_fma(auVar252,(undefined1  [16])0x0,auVar324);
        auVar200 = vshufps_avx(auVar221,auVar221,0xe8);
        auVar188 = vshufps_avx(auVar244,auVar244,0xe8);
        auVar154 = vcmpps_avx(auVar200,auVar188,1);
        uVar63 = vextractps_avx(auVar154,0);
        auVar245 = auVar244;
        if ((uVar63 & 1) == 0) {
          auVar245 = auVar221;
        }
        auVar167 = vmaxss_avx(auVar245,auVar167);
        auVar299 = vminps_avx(auVar299,auVar104);
        auVar104 = vminps_avx(auVar200,auVar188);
        auVar104 = vminps_avx(auVar299,auVar104);
        auVar157 = vshufps_avx(auVar157,auVar157,0x55);
        auVar157 = vblendps_avx(auVar157,auVar154,2);
        auVar154 = vpslld_avx(auVar157,0x1f);
        auVar157 = vshufpd_avx(auVar291,auVar291,1);
        auVar157 = vinsertps_avx(auVar157,auVar244,0x9c);
        auVar299 = vshufpd_avx(auVar130,auVar130,1);
        auVar299 = vinsertps_avx(auVar299,auVar221,0x9c);
        auVar157 = vblendvps_avx(auVar299,auVar157,auVar154);
        auVar299 = vmovshdup_avx(auVar157);
        auVar157 = vmaxss_avx(auVar299,auVar157);
        fVar165 = auVar104._0_4_;
        auVar299 = vmovshdup_avx(auVar104);
        fVar164 = auVar157._0_4_;
        fVar143 = auVar299._0_4_;
        fVar142 = auVar167._0_4_;
        if (((fVar165 < 0.0001) && (-0.0001 < fVar164)) || (fVar143 < 0.0001 && -0.0001 < fVar164))
        {
LAB_01734de5:
          auVar130 = vcmpps_avx(auVar104,_DAT_01f7aa10,1);
          auVar291 = SUB6416(ZEXT864(0),0) << 0x20;
          auVar299 = vcmpss_avx(auVar167,ZEXT816(0) << 0x20,1);
          auVar117._8_4_ = 0x3f800000;
          auVar117._0_8_ = 0x3f8000003f800000;
          auVar117._12_4_ = 0x3f800000;
          auVar136._8_4_ = 0xbf800000;
          auVar136._0_8_ = 0xbf800000bf800000;
          auVar136._12_4_ = 0xbf800000;
          auVar299 = vblendvps_avx(auVar117,auVar136,auVar299);
          auVar130 = vblendvps_avx(auVar117,auVar136,auVar130);
          fVar259 = auVar130._0_4_;
          fVar166 = auVar299._0_4_;
          auVar299 = SUB6416(ZEXT864(0),0) << 0x20;
          if ((fVar259 == fVar166) && (!NAN(fVar259) && !NAN(fVar166))) {
            auVar299 = SUB6416(ZEXT464(0x7f800000),0);
          }
          if ((fVar259 == fVar166) && (!NAN(fVar259) && !NAN(fVar166))) {
            auVar291 = SUB6416(ZEXT464(0xff800000),0);
          }
          auVar130 = vmovshdup_avx(auVar130);
          fVar237 = auVar130._0_4_;
          if ((fVar259 != fVar237) || (NAN(fVar259) || NAN(fVar237))) {
            if ((fVar143 != fVar165) || (NAN(fVar143) || NAN(fVar165))) {
              auVar155._0_8_ = auVar104._0_8_ ^ 0x8000000080000000;
              auVar155._8_4_ = auVar104._8_4_ ^ 0x80000000;
              auVar155._12_4_ = auVar104._12_4_ ^ 0x80000000;
              auVar156._0_4_ = -fVar165 / (fVar143 - fVar165);
              auVar156._4_12_ = auVar155._4_12_;
              auVar104 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar156._0_4_)),auVar156,ZEXT416(0));
              auVar130 = auVar104;
            }
            else {
              auVar104 = ZEXT816(0) << 0x20;
              if ((fVar165 != 0.0) || (auVar130 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar165))) {
                auVar104 = SUB6416(ZEXT464(0x7f800000),0);
                auVar130 = SUB6416(ZEXT464(0xff800000),0);
              }
            }
            auVar299 = vminss_avx(auVar299,auVar104);
            auVar291 = vmaxss_avx(auVar130,auVar291);
          }
          auVar157 = vcmpss_avx(auVar157,ZEXT416(0),1);
          auVar118._8_4_ = 0x3f800000;
          auVar118._0_8_ = 0x3f8000003f800000;
          auVar118._12_4_ = 0x3f800000;
          auVar137._8_4_ = 0xbf800000;
          auVar137._0_8_ = 0xbf800000bf800000;
          auVar137._12_4_ = 0xbf800000;
          auVar157 = vblendvps_avx(auVar118,auVar137,auVar157);
          fVar143 = auVar157._0_4_;
          if ((fVar166 != fVar143) || (NAN(fVar166) || NAN(fVar143))) {
            if ((fVar164 != fVar142) || (NAN(fVar164) || NAN(fVar142))) {
              auVar88._0_8_ = auVar167._0_8_ ^ 0x8000000080000000;
              auVar88._8_4_ = auVar167._8_4_ ^ 0x80000000;
              auVar88._12_4_ = auVar167._12_4_ ^ 0x80000000;
              auVar158._0_4_ = -fVar142 / (fVar164 - fVar142);
              auVar158._4_12_ = auVar88._4_12_;
              auVar157 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar158._0_4_)),auVar158,ZEXT416(0));
              auVar104 = auVar157;
            }
            else {
              auVar157 = SUB6416(ZEXT464(0x3f800000),0);
              if ((fVar142 != 0.0) || (auVar104 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar142))) {
                auVar157 = SUB6416(ZEXT464(0xff800000),0);
                auVar104 = SUB6416(ZEXT464(0x7f800000),0);
              }
            }
            auVar299 = vminss_avx(auVar299,auVar104);
            auVar291 = vmaxss_avx(auVar157,auVar291);
          }
          if ((fVar237 != fVar143) || (NAN(fVar237) || NAN(fVar143))) {
            auVar299 = vminss_avx(auVar299,SUB6416(ZEXT464(0x3f800000),0));
            auVar291 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar291);
          }
          auVar157 = vmaxss_avx(ZEXT816(0) << 0x40,auVar299);
          auVar299 = vminss_avx(auVar291,SUB6416(ZEXT464(0x3f800000),0));
          if (auVar157._0_4_ <= auVar299._0_4_) {
            auVar157 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar157._0_4_ + -0.1)));
            auVar299 = vminss_avx(ZEXT416((uint)(auVar299._0_4_ + 0.1)),
                                  SUB6416(ZEXT464(0x3f800000),0));
            auVar176._0_8_ = auVar131._0_8_;
            auVar176._8_8_ = auVar176._0_8_;
            auVar265._8_8_ = auVar228._0_8_;
            auVar265._0_8_ = auVar228._0_8_;
            auVar279._8_8_ = auVar220._0_8_;
            auVar279._0_8_ = auVar220._0_8_;
            auVar104 = vshufpd_avx(auVar228,auVar228,3);
            auVar130 = vshufpd_avx(auVar220,auVar220,3);
            auVar291 = vshufps_avx(auVar157,auVar299,0);
            auVar89._8_4_ = 0x3f800000;
            auVar89._0_8_ = 0x3f8000003f800000;
            auVar89._12_4_ = 0x3f800000;
            auVar131 = vsubps_avx(auVar89,auVar291);
            local_438._0_4_ = auVar71._0_4_;
            local_438._4_4_ = auVar71._4_4_;
            fStack_430 = auVar71._8_4_;
            fStack_42c = auVar71._12_4_;
            fVar143 = auVar291._0_4_;
            auVar90._0_4_ = fVar143 * (float)local_438._0_4_;
            fVar142 = auVar291._4_4_;
            auVar90._4_4_ = fVar142 * (float)local_438._4_4_;
            fVar164 = auVar291._8_4_;
            auVar90._8_4_ = fVar164 * fStack_430;
            fVar165 = auVar291._12_4_;
            auVar90._12_4_ = fVar165 * fStack_42c;
            auVar215._0_4_ = fVar143 * auVar104._0_4_;
            auVar215._4_4_ = fVar142 * auVar104._4_4_;
            auVar215._8_4_ = fVar164 * auVar104._8_4_;
            auVar215._12_4_ = fVar165 * auVar104._12_4_;
            auVar230._0_4_ = fVar143 * auVar130._0_4_;
            auVar230._4_4_ = fVar142 * auVar130._4_4_;
            auVar230._8_4_ = fVar164 * auVar130._8_4_;
            auVar230._12_4_ = fVar165 * auVar130._12_4_;
            local_528 = auVar69._0_4_;
            fStack_524 = auVar69._4_4_;
            fStack_520 = auVar69._8_4_;
            fStack_51c = auVar69._12_4_;
            auVar253._0_4_ = fVar143 * local_528;
            auVar253._4_4_ = fVar142 * fStack_524;
            auVar253._8_4_ = fVar164 * fStack_520;
            auVar253._12_4_ = fVar165 * fStack_51c;
            auVar104 = vfmadd231ps_fma(auVar90,auVar131,auVar176);
            auVar130 = vfmadd231ps_fma(auVar215,auVar131,auVar265);
            auVar291 = vfmadd231ps_fma(auVar230,auVar131,auVar279);
            auVar131 = vfmadd231ps_fma(auVar253,auVar131,ZEXT816(0));
            auVar71 = vmovshdup_avx(auVar189);
            auVar220 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar157._0_4_)),auVar189,
                                       ZEXT416((uint)(1.0 - auVar157._0_4_)));
            auVar221 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar299._0_4_)),auVar189,
                                       ZEXT416((uint)(1.0 - auVar299._0_4_)));
            fVar143 = 1.0 / fVar101;
            auVar157 = vsubps_avx(auVar130,auVar104);
            auVar266._0_4_ = auVar157._0_4_ * 3.0;
            auVar266._4_4_ = auVar157._4_4_ * 3.0;
            auVar266._8_4_ = auVar157._8_4_ * 3.0;
            auVar266._12_4_ = auVar157._12_4_ * 3.0;
            auVar157 = vsubps_avx(auVar291,auVar130);
            auVar280._0_4_ = auVar157._0_4_ * 3.0;
            auVar280._4_4_ = auVar157._4_4_ * 3.0;
            auVar280._8_4_ = auVar157._8_4_ * 3.0;
            auVar280._12_4_ = auVar157._12_4_ * 3.0;
            auVar157 = vsubps_avx(auVar131,auVar291);
            auVar292._0_4_ = auVar157._0_4_ * 3.0;
            auVar292._4_4_ = auVar157._4_4_ * 3.0;
            auVar292._8_4_ = auVar157._8_4_ * 3.0;
            auVar292._12_4_ = auVar157._12_4_ * 3.0;
            auVar71 = vminps_avx(auVar280,auVar292);
            auVar157 = vmaxps_avx(auVar280,auVar292);
            auVar71 = vminps_avx(auVar266,auVar71);
            auVar157 = vmaxps_avx(auVar266,auVar157);
            auVar69 = vshufpd_avx(auVar71,auVar71,3);
            auVar299 = vshufpd_avx(auVar157,auVar157,3);
            auVar71 = vminps_avx(auVar71,auVar69);
            auVar157 = vmaxps_avx(auVar157,auVar299);
            auVar281._0_4_ = auVar71._0_4_ * fVar143;
            auVar281._4_4_ = auVar71._4_4_ * fVar143;
            auVar281._8_4_ = auVar71._8_4_ * fVar143;
            auVar281._12_4_ = auVar71._12_4_ * fVar143;
            auVar267._0_4_ = auVar157._0_4_ * fVar143;
            auVar267._4_4_ = auVar157._4_4_ * fVar143;
            auVar267._8_4_ = auVar157._8_4_ * fVar143;
            auVar267._12_4_ = auVar157._12_4_ * fVar143;
            fVar143 = 1.0 / (auVar221._0_4_ - auVar220._0_4_);
            auVar157 = vshufpd_avx(auVar104,auVar104,3);
            auVar71 = vshufpd_avx(auVar130,auVar130,3);
            auVar69 = vshufpd_avx(auVar291,auVar291,3);
            auVar299 = vshufpd_avx(auVar131,auVar131,3);
            auVar157 = vsubps_avx(auVar157,auVar104);
            auVar104 = vsubps_avx(auVar71,auVar130);
            auVar130 = vsubps_avx(auVar69,auVar291);
            auVar299 = vsubps_avx(auVar299,auVar131);
            auVar71 = vminps_avx(auVar157,auVar104);
            auVar157 = vmaxps_avx(auVar157,auVar104);
            auVar69 = vminps_avx(auVar130,auVar299);
            auVar69 = vminps_avx(auVar71,auVar69);
            auVar71 = vmaxps_avx(auVar130,auVar299);
            auVar157 = vmaxps_avx(auVar157,auVar71);
            auVar311._0_4_ = fVar143 * auVar69._0_4_;
            auVar311._4_4_ = fVar143 * auVar69._4_4_;
            auVar311._8_4_ = fVar143 * auVar69._8_4_;
            auVar311._12_4_ = fVar143 * auVar69._12_4_;
            auVar300._0_4_ = fVar143 * auVar157._0_4_;
            auVar300._4_4_ = fVar143 * auVar157._4_4_;
            auVar300._8_4_ = fVar143 * auVar157._8_4_;
            auVar300._12_4_ = fVar143 * auVar157._12_4_;
            auVar299 = vinsertps_avx(auVar160,auVar220,0x10);
            auVar104 = vinsertps_avx(auVar161,auVar221,0x10);
            auVar293._0_4_ = (auVar299._0_4_ + auVar104._0_4_) * 0.5;
            auVar293._4_4_ = (auVar299._4_4_ + auVar104._4_4_) * 0.5;
            auVar293._8_4_ = (auVar299._8_4_ + auVar104._8_4_) * 0.5;
            auVar293._12_4_ = (auVar299._12_4_ + auVar104._12_4_) * 0.5;
            auVar91._4_4_ = auVar293._0_4_;
            auVar91._0_4_ = auVar293._0_4_;
            auVar91._8_4_ = auVar293._0_4_;
            auVar91._12_4_ = auVar293._0_4_;
            auVar157 = vfmadd213ps_fma(local_278,auVar91,auVar16);
            auVar71 = vfmadd213ps_fma(local_288,auVar91,auVar17);
            auVar69 = vfmadd213ps_fma(local_298,auVar91,auVar186);
            auVar161 = vsubps_avx(auVar71,auVar157);
            auVar157 = vfmadd213ps_fma(auVar161,auVar91,auVar157);
            auVar161 = vsubps_avx(auVar69,auVar71);
            auVar161 = vfmadd213ps_fma(auVar161,auVar91,auVar71);
            auVar161 = vsubps_avx(auVar161,auVar157);
            auVar157 = vfmadd231ps_fma(auVar157,auVar161,auVar91);
            auVar92._0_8_ = CONCAT44(auVar161._4_4_ * 3.0,auVar161._0_4_ * 3.0);
            auVar92._8_4_ = auVar161._8_4_ * 3.0;
            auVar92._12_4_ = auVar161._12_4_ * 3.0;
            auVar325._8_8_ = auVar157._0_8_;
            auVar325._0_8_ = auVar157._0_8_;
            auVar161 = vshufpd_avx(auVar157,auVar157,3);
            auVar157 = vshufps_avx(auVar293,auVar293,0x55);
            auVar291 = vsubps_avx(auVar161,auVar325);
            auVar167 = vfmadd231ps_fma(auVar325,auVar157,auVar291);
            auVar333._8_8_ = auVar92._0_8_;
            auVar333._0_8_ = auVar92._0_8_;
            auVar161 = vshufpd_avx(auVar92,auVar92,3);
            auVar161 = vsubps_avx(auVar161,auVar333);
            auVar131 = vfmadd213ps_fma(auVar161,auVar157,auVar333);
            auVar157 = vmovshdup_avx(auVar131);
            auVar334._0_8_ = auVar157._0_8_ ^ 0x8000000080000000;
            auVar334._8_4_ = auVar157._8_4_ ^ 0x80000000;
            auVar334._12_4_ = auVar157._12_4_ ^ 0x80000000;
            auVar71 = vmovshdup_avx(auVar291);
            auVar161 = vunpcklps_avx(auVar71,auVar334);
            auVar69 = vshufps_avx(auVar161,auVar334,4);
            auVar130 = vshufps_avx(auVar293,auVar293,0x54);
            auVar159._0_8_ = auVar291._0_8_ ^ 0x8000000080000000;
            auVar159._8_4_ = auVar291._8_4_ ^ 0x80000000;
            auVar159._12_4_ = auVar291._12_4_ ^ 0x80000000;
            auVar161 = vmovlhps_avx(auVar159,auVar131);
            auVar161 = vshufps_avx(auVar161,auVar131,8);
            auVar157 = vfmsub231ss_fma(ZEXT416((uint)(auVar291._0_4_ * auVar157._0_4_)),auVar71,
                                       auVar131);
            uVar68 = auVar157._0_4_;
            auVar93._4_4_ = uVar68;
            auVar93._0_4_ = uVar68;
            auVar93._8_4_ = uVar68;
            auVar93._12_4_ = uVar68;
            auVar157 = vdivps_avx(auVar69,auVar93);
            auVar71 = vdivps_avx(auVar161,auVar93);
            fVar164 = auVar167._0_4_;
            fVar143 = auVar157._0_4_;
            auVar161 = vshufps_avx(auVar167,auVar167,0x55);
            fVar142 = auVar71._0_4_;
            auVar94._0_4_ = fVar164 * fVar143 + auVar161._0_4_ * fVar142;
            auVar94._4_4_ = fVar164 * auVar157._4_4_ + auVar161._4_4_ * auVar71._4_4_;
            auVar94._8_4_ = fVar164 * auVar157._8_4_ + auVar161._8_4_ * auVar71._8_4_;
            auVar94._12_4_ = fVar164 * auVar157._12_4_ + auVar161._12_4_ * auVar71._12_4_;
            auVar188 = vsubps_avx(auVar130,auVar94);
            auVar130 = vmovshdup_avx(auVar157);
            auVar161 = vinsertps_avx(auVar281,auVar311,0x1c);
            auVar192._0_4_ = auVar130._0_4_ * auVar161._0_4_;
            auVar192._4_4_ = auVar130._4_4_ * auVar161._4_4_;
            auVar192._8_4_ = auVar130._8_4_ * auVar161._8_4_;
            auVar192._12_4_ = auVar130._12_4_ * auVar161._12_4_;
            auVar69 = vinsertps_avx(auVar267,auVar300,0x1c);
            auVar119._0_4_ = auVar69._0_4_ * auVar130._0_4_;
            auVar119._4_4_ = auVar69._4_4_ * auVar130._4_4_;
            auVar119._8_4_ = auVar69._8_4_ * auVar130._8_4_;
            auVar119._12_4_ = auVar69._12_4_ * auVar130._12_4_;
            auVar167 = vminps_avx(auVar192,auVar119);
            auVar131 = vmaxps_avx(auVar119,auVar192);
            auVar130 = vinsertps_avx(auVar311,auVar281,0x4c);
            auVar154 = vmovshdup_avx(auVar71);
            auVar291 = vinsertps_avx(auVar300,auVar267,0x4c);
            auVar301._0_4_ = auVar154._0_4_ * auVar130._0_4_;
            auVar301._4_4_ = auVar154._4_4_ * auVar130._4_4_;
            auVar301._8_4_ = auVar154._8_4_ * auVar130._8_4_;
            auVar301._12_4_ = auVar154._12_4_ * auVar130._12_4_;
            auVar282._0_4_ = auVar154._0_4_ * auVar291._0_4_;
            auVar282._4_4_ = auVar154._4_4_ * auVar291._4_4_;
            auVar282._8_4_ = auVar154._8_4_ * auVar291._8_4_;
            auVar282._12_4_ = auVar154._12_4_ * auVar291._12_4_;
            auVar154 = vminps_avx(auVar301,auVar282);
            auVar312._0_4_ = auVar167._0_4_ + auVar154._0_4_;
            auVar312._4_4_ = auVar167._4_4_ + auVar154._4_4_;
            auVar312._8_4_ = auVar167._8_4_ + auVar154._8_4_;
            auVar312._12_4_ = auVar167._12_4_ + auVar154._12_4_;
            auVar167 = vmaxps_avx(auVar282,auVar301);
            auVar120._0_4_ = auVar167._0_4_ + auVar131._0_4_;
            auVar120._4_4_ = auVar167._4_4_ + auVar131._4_4_;
            auVar120._8_4_ = auVar167._8_4_ + auVar131._8_4_;
            auVar120._12_4_ = auVar167._12_4_ + auVar131._12_4_;
            auVar283._8_8_ = 0x3f80000000000000;
            auVar283._0_8_ = 0x3f80000000000000;
            auVar131 = vsubps_avx(auVar283,auVar120);
            auVar167 = vsubps_avx(auVar283,auVar312);
            auVar154 = vsubps_avx(auVar299,auVar293);
            auVar200 = vsubps_avx(auVar104,auVar293);
            auVar138._0_4_ = fVar143 * auVar161._0_4_;
            auVar138._4_4_ = fVar143 * auVar161._4_4_;
            auVar138._8_4_ = fVar143 * auVar161._8_4_;
            auVar138._12_4_ = fVar143 * auVar161._12_4_;
            auVar313._0_4_ = fVar143 * auVar69._0_4_;
            auVar313._4_4_ = fVar143 * auVar69._4_4_;
            auVar313._8_4_ = fVar143 * auVar69._8_4_;
            auVar313._12_4_ = fVar143 * auVar69._12_4_;
            auVar69 = vminps_avx(auVar138,auVar313);
            auVar161 = vmaxps_avx(auVar313,auVar138);
            auVar193._0_4_ = fVar142 * auVar130._0_4_;
            auVar193._4_4_ = fVar142 * auVar130._4_4_;
            auVar193._8_4_ = fVar142 * auVar130._8_4_;
            auVar193._12_4_ = fVar142 * auVar130._12_4_;
            auVar268._0_4_ = fVar142 * auVar291._0_4_;
            auVar268._4_4_ = fVar142 * auVar291._4_4_;
            auVar268._8_4_ = fVar142 * auVar291._8_4_;
            auVar268._12_4_ = fVar142 * auVar291._12_4_;
            auVar130 = vminps_avx(auVar193,auVar268);
            auVar314._0_4_ = auVar69._0_4_ + auVar130._0_4_;
            auVar314._4_4_ = auVar69._4_4_ + auVar130._4_4_;
            auVar314._8_4_ = auVar69._8_4_ + auVar130._8_4_;
            auVar314._12_4_ = auVar69._12_4_ + auVar130._12_4_;
            fVar237 = auVar154._0_4_;
            auVar326._0_4_ = fVar237 * auVar131._0_4_;
            fVar238 = auVar154._4_4_;
            auVar326._4_4_ = fVar238 * auVar131._4_4_;
            fVar239 = auVar154._8_4_;
            auVar326._8_4_ = fVar239 * auVar131._8_4_;
            fVar240 = auVar154._12_4_;
            auVar326._12_4_ = fVar240 * auVar131._12_4_;
            auVar69 = vmaxps_avx(auVar268,auVar193);
            auVar269._0_4_ = fVar237 * auVar167._0_4_;
            auVar269._4_4_ = fVar238 * auVar167._4_4_;
            auVar269._8_4_ = fVar239 * auVar167._8_4_;
            auVar269._12_4_ = fVar240 * auVar167._12_4_;
            fVar164 = auVar200._0_4_;
            auVar121._0_4_ = fVar164 * auVar131._0_4_;
            fVar165 = auVar200._4_4_;
            auVar121._4_4_ = fVar165 * auVar131._4_4_;
            fVar166 = auVar200._8_4_;
            auVar121._8_4_ = fVar166 * auVar131._8_4_;
            fVar259 = auVar200._12_4_;
            auVar121._12_4_ = fVar259 * auVar131._12_4_;
            auVar284._0_4_ = fVar164 * auVar167._0_4_;
            auVar284._4_4_ = fVar165 * auVar167._4_4_;
            auVar284._8_4_ = fVar166 * auVar167._8_4_;
            auVar284._12_4_ = fVar259 * auVar167._12_4_;
            auVar139._0_4_ = auVar161._0_4_ + auVar69._0_4_;
            auVar139._4_4_ = auVar161._4_4_ + auVar69._4_4_;
            auVar139._8_4_ = auVar161._8_4_ + auVar69._8_4_;
            auVar139._12_4_ = auVar161._12_4_ + auVar69._12_4_;
            auVar194._8_8_ = 0x3f800000;
            auVar194._0_8_ = 0x3f800000;
            auVar161 = vsubps_avx(auVar194,auVar139);
            auVar69 = vsubps_avx(auVar194,auVar314);
            auVar315._0_4_ = fVar237 * auVar161._0_4_;
            auVar315._4_4_ = fVar238 * auVar161._4_4_;
            auVar315._8_4_ = fVar239 * auVar161._8_4_;
            auVar315._12_4_ = fVar240 * auVar161._12_4_;
            auVar302._0_4_ = fVar237 * auVar69._0_4_;
            auVar302._4_4_ = fVar238 * auVar69._4_4_;
            auVar302._8_4_ = fVar239 * auVar69._8_4_;
            auVar302._12_4_ = fVar240 * auVar69._12_4_;
            auVar140._0_4_ = fVar164 * auVar161._0_4_;
            auVar140._4_4_ = fVar165 * auVar161._4_4_;
            auVar140._8_4_ = fVar166 * auVar161._8_4_;
            auVar140._12_4_ = fVar259 * auVar161._12_4_;
            auVar195._0_4_ = fVar164 * auVar69._0_4_;
            auVar195._4_4_ = fVar165 * auVar69._4_4_;
            auVar195._8_4_ = fVar166 * auVar69._8_4_;
            auVar195._12_4_ = fVar259 * auVar69._12_4_;
            auVar161 = vminps_avx(auVar315,auVar302);
            auVar69 = vminps_avx(auVar140,auVar195);
            auVar161 = vminps_avx(auVar161,auVar69);
            auVar69 = vmaxps_avx(auVar302,auVar315);
            auVar130 = vmaxps_avx(auVar195,auVar140);
            auVar291 = vminps_avx(auVar326,auVar269);
            auVar131 = vminps_avx(auVar121,auVar284);
            auVar291 = vminps_avx(auVar291,auVar131);
            auVar161 = vhaddps_avx(auVar161,auVar291);
            auVar69 = vmaxps_avx(auVar130,auVar69);
            auVar130 = vmaxps_avx(auVar269,auVar326);
            auVar291 = vmaxps_avx(auVar284,auVar121);
            auVar130 = vmaxps_avx(auVar291,auVar130);
            auVar69 = vhaddps_avx(auVar69,auVar130);
            auVar161 = vshufps_avx(auVar161,auVar161,0xe8);
            auVar69 = vshufps_avx(auVar69,auVar69,0xe8);
            auVar285._0_4_ = auVar188._0_4_ + auVar161._0_4_;
            auVar285._4_4_ = auVar188._4_4_ + auVar161._4_4_;
            auVar285._8_4_ = auVar188._8_4_ + auVar161._8_4_;
            auVar285._12_4_ = auVar188._12_4_ + auVar161._12_4_;
            auVar270._0_4_ = auVar188._0_4_ + auVar69._0_4_;
            auVar270._4_4_ = auVar188._4_4_ + auVar69._4_4_;
            auVar270._8_4_ = auVar188._8_4_ + auVar69._8_4_;
            auVar270._12_4_ = auVar188._12_4_ + auVar69._12_4_;
            auVar161 = vmaxps_avx(auVar299,auVar285);
            auVar69 = vminps_avx(auVar270,auVar104);
            auVar161 = vcmpps_avx(auVar69,auVar161,1);
            auVar161 = vshufps_avx(auVar161,auVar161,0x50);
            if ((auVar161 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                -1 < auVar161[0xf]) {
              bVar61 = 0;
              if ((fVar67 < auVar285._0_4_) && (bVar61 = 0, auVar270._0_4_ < auVar104._0_4_)) {
                auVar69 = vmovshdup_avx(auVar285);
                auVar161 = vcmpps_avx(auVar270,auVar104,1);
                bVar61 = auVar161[4] & auVar220._0_4_ < auVar69._0_4_;
              }
              if (((3 < uVar65 || fVar101 < 0.001) | bVar61) != 1) goto LAB_01735a58;
              lVar60 = 200;
              do {
                fVar164 = auVar188._0_4_;
                fVar67 = 1.0 - fVar164;
                fVar101 = fVar67 * fVar67 * fVar67;
                fVar144 = fVar164 * 3.0 * fVar67 * fVar67;
                fVar67 = fVar67 * fVar164 * fVar164 * 3.0;
                auVar177._4_4_ = fVar101;
                auVar177._0_4_ = fVar101;
                auVar177._8_4_ = fVar101;
                auVar177._12_4_ = fVar101;
                auVar141._4_4_ = fVar144;
                auVar141._0_4_ = fVar144;
                auVar141._8_4_ = fVar144;
                auVar141._12_4_ = fVar144;
                auVar122._4_4_ = fVar67;
                auVar122._0_4_ = fVar67;
                auVar122._8_4_ = fVar67;
                auVar122._12_4_ = fVar67;
                fVar164 = fVar164 * fVar164 * fVar164;
                local_548 = auVar18._0_4_;
                fStack_544 = auVar18._4_4_;
                fStack_540 = auVar18._8_4_;
                fStack_53c = auVar18._12_4_;
                auVar196._0_4_ = fVar164 * local_548;
                auVar196._4_4_ = fVar164 * fStack_544;
                auVar196._8_4_ = fVar164 * fStack_540;
                auVar196._12_4_ = fVar164 * fStack_53c;
                auVar160 = vfmadd231ps_fma(auVar196,auVar122,auVar186);
                auVar160 = vfmadd231ps_fma(auVar160,auVar141,auVar17);
                auVar160 = vfmadd231ps_fma(auVar160,auVar177,auVar16);
                auVar123._8_8_ = auVar160._0_8_;
                auVar123._0_8_ = auVar160._0_8_;
                auVar160 = vshufpd_avx(auVar160,auVar160,3);
                auVar161 = vshufps_avx(auVar188,auVar188,0x55);
                auVar160 = vsubps_avx(auVar160,auVar123);
                auVar161 = vfmadd213ps_fma(auVar160,auVar161,auVar123);
                fVar101 = auVar161._0_4_;
                auVar160 = vshufps_avx(auVar161,auVar161,0x55);
                auVar124._0_4_ = fVar143 * fVar101 + fVar142 * auVar160._0_4_;
                auVar124._4_4_ = auVar157._4_4_ * fVar101 + auVar71._4_4_ * auVar160._4_4_;
                auVar124._8_4_ = auVar157._8_4_ * fVar101 + auVar71._8_4_ * auVar160._8_4_;
                auVar124._12_4_ = auVar157._12_4_ * fVar101 + auVar71._12_4_ * auVar160._12_4_;
                auVar188 = vsubps_avx(auVar188,auVar124);
                auVar160 = vandps_avx(local_398,auVar161);
                auVar161 = vshufps_avx(auVar160,auVar160,0xf5);
                auVar160 = vmaxss_avx(auVar161,auVar160);
                if (auVar160._0_4_ < fVar100) {
                  local_1f8 = auVar188._0_4_;
                  if ((0.0 <= local_1f8) && (local_1f8 <= 1.0)) {
                    auVar160 = vmovshdup_avx(auVar188);
                    fVar101 = auVar160._0_4_;
                    if ((0.0 <= fVar101) && (fVar101 <= 1.0)) {
                      auVar160 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                               ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),
                                               0x1c);
                      auVar130 = vinsertps_avx(auVar160,ZEXT416((uint)pre->ray_space[k].vz.field_0.
                                                                      m128[2]),0x28);
                      auVar160 = vdpps_avx(auVar130,local_3a8,0x7f);
                      auVar161 = vdpps_avx(auVar130,local_3b8,0x7f);
                      auVar157 = vdpps_avx(auVar130,local_2a8,0x7f);
                      auVar71 = vdpps_avx(auVar130,local_2b8,0x7f);
                      auVar69 = vdpps_avx(auVar130,local_2c8,0x7f);
                      auVar299 = vdpps_avx(auVar130,local_2d8,0x7f);
                      auVar104 = vdpps_avx(auVar130,local_2e8,0x7f);
                      auVar130 = vdpps_avx(auVar130,local_2f8,0x7f);
                      fVar144 = 1.0 - fVar101;
                      auVar160 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * auVar69._0_4_)),
                                                 ZEXT416((uint)fVar144),auVar160);
                      auVar161 = vfmadd231ss_fma(ZEXT416((uint)(auVar299._0_4_ * fVar101)),
                                                 ZEXT416((uint)fVar144),auVar161);
                      auVar157 = vfmadd231ss_fma(ZEXT416((uint)(auVar104._0_4_ * fVar101)),
                                                 ZEXT416((uint)fVar144),auVar157);
                      auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar101 * auVar130._0_4_)),
                                                ZEXT416((uint)fVar144),auVar71);
                      fVar142 = 1.0 - local_1f8;
                      fVar144 = fVar142 * local_1f8 * local_1f8 * 3.0;
                      fVar165 = local_1f8 * local_1f8 * local_1f8;
                      auVar157 = vfmadd231ss_fma(ZEXT416((uint)(fVar165 * auVar71._0_4_)),
                                                 ZEXT416((uint)fVar144),auVar157);
                      fVar67 = local_1f8 * 3.0 * fVar142 * fVar142;
                      auVar161 = vfmadd231ss_fma(auVar157,ZEXT416((uint)fVar67),auVar161);
                      fVar143 = fVar142 * fVar142 * fVar142;
                      auVar160 = vfmadd231ss_fma(auVar161,ZEXT416((uint)fVar143),auVar160);
                      fVar164 = auVar160._0_4_;
                      if (((fVar66 <= fVar164) &&
                          (fVar166 = *(float *)(ray + k * 4 + 0x80), fVar164 <= fVar166)) &&
                         (pGVar8 = (context->scene->geometries).items[uVar57].ptr,
                         (pGVar8->mask & *(uint *)(ray + k * 4 + 0x90)) != 0)) {
                        auVar160 = vshufps_avx(auVar188,auVar188,0x55);
                        auVar271._8_4_ = 0x3f800000;
                        auVar271._0_8_ = 0x3f8000003f800000;
                        auVar271._12_4_ = 0x3f800000;
                        auVar161 = vsubps_avx(auVar271,auVar160);
                        fVar259 = auVar160._0_4_;
                        auVar286._0_4_ = fVar259 * (float)local_3e8._0_4_;
                        fVar237 = auVar160._4_4_;
                        auVar286._4_4_ = fVar237 * (float)local_3e8._4_4_;
                        fVar238 = auVar160._8_4_;
                        auVar286._8_4_ = fVar238 * fStack_3e0;
                        fVar239 = auVar160._12_4_;
                        auVar286._12_4_ = fVar239 * fStack_3dc;
                        local_4c8 = auVar20._0_4_;
                        fStack_4c4 = auVar20._4_4_;
                        fStack_4c0 = auVar20._8_4_;
                        fStack_4bc = auVar20._12_4_;
                        auVar294._0_4_ = fVar259 * local_4c8;
                        auVar294._4_4_ = fVar237 * fStack_4c4;
                        auVar294._8_4_ = fVar238 * fStack_4c0;
                        auVar294._12_4_ = fVar239 * fStack_4bc;
                        local_4d8 = auVar132._0_4_;
                        fStack_4d4 = auVar132._4_4_;
                        fStack_4d0 = auVar132._8_4_;
                        fStack_4cc = auVar132._12_4_;
                        auVar303._0_4_ = fVar259 * local_4d8;
                        auVar303._4_4_ = fVar237 * fStack_4d4;
                        auVar303._8_4_ = fVar238 * fStack_4d0;
                        auVar303._12_4_ = fVar239 * fStack_4cc;
                        local_4e8 = auVar147._0_4_;
                        fStack_4e4 = auVar147._4_4_;
                        fStack_4e0 = auVar147._8_4_;
                        fStack_4dc = auVar147._12_4_;
                        auVar316._0_4_ = fVar259 * local_4e8;
                        auVar316._4_4_ = fVar237 * fStack_4e4;
                        auVar316._8_4_ = fVar238 * fStack_4e0;
                        auVar316._12_4_ = fVar239 * fStack_4dc;
                        auVar157 = vfmadd231ps_fma(auVar286,auVar161,local_3c8);
                        auVar71 = vfmadd231ps_fma(auVar294,auVar161,auVar19);
                        auVar69 = vfmadd231ps_fma(auVar303,auVar161,local_3d8);
                        auVar299 = vfmadd231ps_fma(auVar316,auVar161,auVar112);
                        auVar161 = vsubps_avx(auVar71,auVar157);
                        auVar157 = vsubps_avx(auVar69,auVar71);
                        auVar71 = vsubps_avx(auVar299,auVar69);
                        auVar317._0_4_ = local_1f8 * auVar157._0_4_;
                        auVar317._4_4_ = local_1f8 * auVar157._4_4_;
                        auVar317._8_4_ = local_1f8 * auVar157._8_4_;
                        auVar317._12_4_ = local_1f8 * auVar157._12_4_;
                        auVar254._4_4_ = fVar142;
                        auVar254._0_4_ = fVar142;
                        auVar254._8_4_ = fVar142;
                        auVar254._12_4_ = fVar142;
                        auVar161 = vfmadd231ps_fma(auVar317,auVar254,auVar161);
                        auVar287._0_4_ = local_1f8 * auVar71._0_4_;
                        auVar287._4_4_ = local_1f8 * auVar71._4_4_;
                        auVar287._8_4_ = local_1f8 * auVar71._8_4_;
                        auVar287._12_4_ = local_1f8 * auVar71._12_4_;
                        auVar157 = vfmadd231ps_fma(auVar287,auVar254,auVar157);
                        auVar288._0_4_ = local_1f8 * auVar157._0_4_;
                        auVar288._4_4_ = local_1f8 * auVar157._4_4_;
                        auVar288._8_4_ = local_1f8 * auVar157._8_4_;
                        auVar288._12_4_ = local_1f8 * auVar157._12_4_;
                        auVar157 = vfmadd231ps_fma(auVar288,auVar254,auVar161);
                        auVar231._0_4_ = fVar165 * (float)local_348._0_4_;
                        auVar231._4_4_ = fVar165 * (float)local_348._4_4_;
                        auVar231._8_4_ = fVar165 * fStack_340;
                        auVar231._12_4_ = fVar165 * fStack_33c;
                        auVar178._4_4_ = fVar144;
                        auVar178._0_4_ = fVar144;
                        auVar178._8_4_ = fVar144;
                        auVar178._12_4_ = fVar144;
                        auVar161 = vfmadd132ps_fma(auVar178,auVar231,local_338);
                        auVar216._4_4_ = fVar67;
                        auVar216._0_4_ = fVar67;
                        auVar216._8_4_ = fVar67;
                        auVar216._12_4_ = fVar67;
                        auVar161 = vfmadd132ps_fma(auVar216,auVar161,local_328);
                        auVar232._0_4_ = auVar157._0_4_ * 3.0;
                        auVar232._4_4_ = auVar157._4_4_ * 3.0;
                        auVar232._8_4_ = auVar157._8_4_ * 3.0;
                        auVar232._12_4_ = auVar157._12_4_ * 3.0;
                        auVar197._4_4_ = fVar143;
                        auVar197._0_4_ = fVar143;
                        auVar197._8_4_ = fVar143;
                        auVar197._12_4_ = fVar143;
                        auVar157 = vfmadd132ps_fma(auVar197,auVar161,local_318);
                        auVar161 = vshufps_avx(auVar232,auVar232,0xc9);
                        auVar179._0_4_ = auVar157._0_4_ * auVar161._0_4_;
                        auVar179._4_4_ = auVar157._4_4_ * auVar161._4_4_;
                        auVar179._8_4_ = auVar157._8_4_ * auVar161._8_4_;
                        auVar179._12_4_ = auVar157._12_4_ * auVar161._12_4_;
                        auVar161 = vshufps_avx(auVar157,auVar157,0xc9);
                        auVar161 = vfmsub231ps_fma(auVar179,auVar232,auVar161);
                        local_208 = auVar161._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar164;
                          uVar68 = vextractps_avx(auVar161,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar68;
                          uVar68 = vextractps_avx(auVar161,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar68;
                          *(undefined4 *)(ray + k * 4 + 0xe0) = local_208;
                          *(float *)(ray + k * 4 + 0xf0) = local_1f8;
                          *(float *)(ray + k * 4 + 0x100) = fVar101;
                          *(uint *)(ray + k * 4 + 0x110) = uVar7;
                          *(uint *)(ray + k * 4 + 0x120) = uVar57;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          auVar157 = vshufps_avx(auVar161,auVar161,0x55);
                          auVar161 = vshufps_avx(auVar161,auVar161,0xaa);
                          local_228[0] = (RTCHitN)auVar157[0];
                          local_228[1] = (RTCHitN)auVar157[1];
                          local_228[2] = (RTCHitN)auVar157[2];
                          local_228[3] = (RTCHitN)auVar157[3];
                          local_228[4] = (RTCHitN)auVar157[4];
                          local_228[5] = (RTCHitN)auVar157[5];
                          local_228[6] = (RTCHitN)auVar157[6];
                          local_228[7] = (RTCHitN)auVar157[7];
                          local_228[8] = (RTCHitN)auVar157[8];
                          local_228[9] = (RTCHitN)auVar157[9];
                          local_228[10] = (RTCHitN)auVar157[10];
                          local_228[0xb] = (RTCHitN)auVar157[0xb];
                          local_228[0xc] = (RTCHitN)auVar157[0xc];
                          local_228[0xd] = (RTCHitN)auVar157[0xd];
                          local_228[0xe] = (RTCHitN)auVar157[0xe];
                          local_228[0xf] = (RTCHitN)auVar157[0xf];
                          local_218 = auVar161;
                          uStack_204 = local_208;
                          uStack_200 = local_208;
                          uStack_1fc = local_208;
                          fStack_1f4 = local_1f8;
                          fStack_1f0 = local_1f8;
                          fStack_1ec = local_1f8;
                          local_1e8 = auVar160;
                          local_1d8 = CONCAT44(uStack_374,local_378);
                          uStack_1d0 = CONCAT44(uStack_36c,uStack_370);
                          local_1c8._4_4_ = uStack_364;
                          local_1c8._0_4_ = local_368;
                          local_1c8._8_4_ = uStack_360;
                          local_1c8._12_4_ = uStack_35c;
                          vpcmpeqd_avx2(ZEXT1632(local_1c8),ZEXT1632(local_1c8));
                          uStack_1b4 = context->user->instID[0];
                          local_1b8 = uStack_1b4;
                          uStack_1b0 = uStack_1b4;
                          uStack_1ac = uStack_1b4;
                          uStack_1a8 = context->user->instPrimID[0];
                          uStack_1a4 = uStack_1a8;
                          uStack_1a0 = uStack_1a8;
                          uStack_19c = uStack_1a8;
                          *(float *)(ray + k * 4 + 0x80) = fVar164;
                          local_458 = *local_448;
                          local_418.valid = (int *)local_458;
                          local_418.geometryUserPtr = pGVar8->userPtr;
                          local_418.context = context->user;
                          local_418.hit = local_228;
                          local_418.N = 4;
                          local_418.ray = (RTCRayN *)ray;
                          if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar8->intersectionFilterN)(&local_418);
                            auVar199._8_56_ = extraout_var;
                            auVar199._0_8_ = extraout_XMM1_Qa;
                            auVar161 = auVar199._0_16_;
                          }
                          if (local_458 == (undefined1  [16])0x0) {
                            auVar160 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar161 = vpcmpeqd_avx(auVar161,auVar161);
                            auVar160 = auVar160 ^ auVar161;
                          }
                          else {
                            p_Var14 = context->args->filter;
                            auVar161 = vpcmpeqd_avx(auVar160,auVar160);
                            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var14)(&local_418);
                              auVar161 = vpcmpeqd_avx(auVar161,auVar161);
                            }
                            auVar157 = vpcmpeqd_avx(local_458,_DAT_01f7aa10);
                            auVar160 = auVar157 ^ auVar161;
                            if (local_458 != (undefined1  [16])0x0) {
                              auVar157 = auVar157 ^ auVar161;
                              auVar161 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])local_418.hit
                                                       );
                              *(undefined1 (*) [16])(local_418.ray + 0xc0) = auVar161;
                              auVar161 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x10));
                              *(undefined1 (*) [16])(local_418.ray + 0xd0) = auVar161;
                              auVar161 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x20));
                              *(undefined1 (*) [16])(local_418.ray + 0xe0) = auVar161;
                              auVar161 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x30));
                              *(undefined1 (*) [16])(local_418.ray + 0xf0) = auVar161;
                              auVar161 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x40));
                              *(undefined1 (*) [16])(local_418.ray + 0x100) = auVar161;
                              auVar161 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x50));
                              *(undefined1 (*) [16])(local_418.ray + 0x110) = auVar161;
                              auVar161 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x60));
                              *(undefined1 (*) [16])(local_418.ray + 0x120) = auVar161;
                              auVar161 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x70));
                              *(undefined1 (*) [16])(local_418.ray + 0x130) = auVar161;
                              auVar161 = vmaskmovps_avx(auVar157,*(undefined1 (*) [16])
                                                                  (local_418.hit + 0x80));
                              *(undefined1 (*) [16])(local_418.ray + 0x140) = auVar161;
                            }
                          }
                          auVar95._8_8_ = 0x100000001;
                          auVar95._0_8_ = 0x100000001;
                          if ((auVar95 & auVar160) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar166;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar60 = lVar60 + -1;
              } while (lVar60 != 0);
            }
          }
        }
        else {
          auVar299 = vcmpps_avx(auVar299,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar130 = vcmpps_avx(auVar104,SUB6416(ZEXT464(0x38d1b717),0),5);
          auVar299 = vandps_avx(auVar130,auVar299);
          if (-0.0001 < fVar142 && (auVar299 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_01734de5;
        }
        if (uVar65 == 0) break;
      } while( true );
    }
    uVar68 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar96._4_4_ = uVar68;
    auVar96._0_4_ = uVar68;
    auVar96._8_4_ = uVar68;
    auVar96._12_4_ = uVar68;
    auVar160 = vcmpps_avx(local_358,auVar96,2);
    uVar57 = vmovmskps_avx(auVar160);
    uVar56 = uVar56 & uVar56 + 0xf & uVar57;
    if (uVar56 == 0) {
      return;
    }
  } while( true );
LAB_01735a58:
  auVar160 = vinsertps_avx(auVar160,ZEXT416((uint)fVar144),0x10);
  auVar295 = ZEXT1664(auVar160);
  auVar160 = vinsertps_avx(auVar220,ZEXT416((uint)auVar221._0_4_),0x10);
  auVar199 = ZEXT1664(auVar160);
  goto LAB_01734526;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }